

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

int pbrt::RandomWalk(Integrator *integrator,SampledWavelengths *lambda,RayDifferential *ray,
                    SamplerHandle *sampler,CameraHandle *camera,ScratchBuffer *scratchBuffer,
                    SampledSpectrum beta,Float pdf,int maxDepth,TransportMode mode,Vertex *path,
                    bool regularize)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar6;
  undefined8 uVar4;
  Interval IVar5;
  uint uVar7;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
  TVar8;
  uintptr_t uVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  byte bVar76;
  ushort uVar77;
  Vector3f woRender;
  undefined1 auVar78 [32];
  Interval IVar79;
  SampledWavelengths *pSVar80;
  Vertex *pVVar81;
  SamplerHandle *pSVar82;
  undefined8 uVar83;
  undefined4 uVar84;
  uint uVar85;
  ulong uVar86;
  ulong uVar87;
  float *pfVar88;
  uint *puVar89;
  Tuple3<pbrt::Point3,_float> *pTVar90;
  uint *puVar91;
  uint uVar92;
  long lVar93;
  undefined8 *puVar94;
  float *pfVar95;
  HaltonSampler *this;
  DebugMLTSampler *this_00;
  uint uVar96;
  undefined1 auVar97 [8];
  uint uVar98;
  uint uVar99;
  float *pfVar100;
  Ray *pRVar101;
  uint *puVar102;
  uint *puVar103;
  DenselySampledSpectrum *this_01;
  PrimitiveHandle *this_02;
  Vertex *pVVar104;
  uint uVar105;
  long in_FS_OFFSET;
  bool bVar106;
  ulong uVar107;
  int iVar108;
  int iVar109;
  int iVar110;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  Float FVar120;
  float fVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  Tuple2<pbrt::Point2,_float> u2;
  undefined1 extraout_var [12];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar142 [64];
  undefined1 auVar157 [56];
  undefined1 auVar143 [64];
  undefined1 auVar144 [64];
  undefined1 auVar145 [64];
  undefined1 auVar146 [64];
  undefined1 auVar147 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [64];
  undefined1 auVar152 [64];
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar155 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar156 [64];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar193;
  float fVar195;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar194 [56];
  undefined1 auVar179 [64];
  undefined1 auVar180 [64];
  undefined1 auVar181 [64];
  undefined1 auVar182 [64];
  undefined1 auVar183 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  float fVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar210;
  undefined4 uVar211;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar225;
  float fVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [64];
  float fVar229;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 in_ZMM5 [64];
  float fVar240;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [64];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [12];
  Float t1;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [64];
  Float t0;
  undefined4 in_XMM13_Da;
  undefined1 in_register_00001544 [12];
  Point3f p;
  Point3f p_00;
  Vector3f woRender_00;
  Vector3f wi;
  SampledSpectrum SVar265;
  Vector3f wiRender;
  Float pdfFwd;
  int voxel [3];
  Float nextCrossingT [3];
  optional<pbrt::BSDFSample> bs;
  int voxelLimit [3];
  int step [3];
  Float deltaT [3];
  BSDF bsdf;
  optional<pbrt::ShapeIntersection> si;
  bool local_5ff;
  bool local_5fe;
  bool local_5fd;
  Tuple3<pbrt::Point3,_float> local_5fc;
  float local_5f0;
  int local_5ec;
  undefined1 local_5e8 [8];
  float fStack_5e0;
  float fStack_5dc;
  Float local_5d4;
  Tuple3<pbrt::Point3,_float> local_5d0;
  uint local_5c0 [3];
  float local_5b4 [3];
  undefined1 local_5a8 [16];
  undefined1 local_598 [8];
  float fStack_590;
  float fStack_58c;
  undefined1 local_588 [4];
  undefined1 auStack_584 [40];
  bool local_55c;
  RayDifferential *local_558;
  uint *local_550;
  SampledWavelengths *local_548;
  Vertex *local_540;
  undefined1 local_538 [16];
  SamplerHandle *local_528;
  uint local_51c [4];
  uint local_50c;
  uint local_508;
  float local_504 [3];
  undefined1 local_4f8 [16];
  Vertex *local_4e0;
  undefined1 local_4d8 [8];
  float fStack_4d0;
  float fStack_4cc;
  SampledSpectrum local_4c8;
  undefined1 local_4b8 [16];
  undefined8 local_4a8;
  float fStack_4a0;
  float fStack_49c;
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  float local_488;
  float fStack_484;
  float fStack_480;
  float fStack_47c;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  anon_class_88_11_14aa307c local_468;
  undefined1 local_410 [20];
  float fStack_3fc;
  Float FStack_3f8;
  MediumHandle local_3f0;
  undefined8 local_3e8;
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [8];
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  TransportMode local_3a0;
  int local_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 auStack_388 [16];
  undefined1 local_378 [16];
  Interval *local_360;
  CameraHandle *local_358;
  ScratchBuffer *local_350;
  PrimitiveHandle *local_348;
  SamplerHandle local_340;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_338;
  undefined1 local_330 [24];
  anon_union_248_3_83785cfc_for_Vertex_2 aStack_318;
  BxDFHandle local_220;
  bool *pbStack_218;
  SampledSpectrum *pSStack_210;
  Vertex *local_208;
  Float *pFStack_200;
  undefined1 auStack_1f8 [16];
  bool local_1e8;
  undefined8 local_1e4;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_1b8;
  undefined8 local_b8;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [32];
  undefined1 auVar111 [16];
  undefined1 auVar148 [64];
  undefined1 auVar151 [64];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 auVar184 [64];
  undefined1 auVar187 [64];
  
  auVar228._8_56_ = beta._16_56_;
  auVar228._0_8_ = beta.values.values._8_8_;
  auVar142._8_56_ = beta._8_56_;
  auVar142._0_8_ = beta.values.values._0_8_;
  local_4c8.values.values = (array<float,_4>)vmovlhps_avx(auVar142._0_16_,auVar228._0_16_);
  local_528 = sampler;
  local_548 = lambda;
  if (maxDepth == 0) {
    return 0;
  }
  auVar142 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
  this_02 = &integrator->aggregate;
  local_58 = auVar228._0_32_;
  local_358 = camera;
  local_350 = scratchBuffer;
  local_558 = ray;
  local_5ec = 0;
  local_348 = this_02;
  local_5fe = false;
  local_5d4 = pdf;
  local_3a0 = (uint)(mode == Radiance);
  local_360 = (Interval *)&ray->hasDifferentials;
  pVVar104 = path;
LAB_003f1558:
  local_5a8 = auVar142._0_16_;
  if ((local_4c8.values.values[0] == 0.0) && (!NAN(local_4c8.values.values[0]))) {
    uVar86 = 0xffffffffffffffff;
    do {
      if (uVar86 == 2) goto LAB_003f4b1d;
      fVar121 = local_4c8.values.values[uVar86 + 2];
      uVar86 = uVar86 + 1;
    } while ((fVar121 == 0.0) && (!NAN(fVar121)));
    if (2 < uVar86) goto LAB_003f4b1d;
  }
  lVar93 = (long)local_5ec;
  *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
  local_5ff = false;
  local_5fd = false;
  if (((this_02->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits & 0xffffffffffff) == 0) {
    auVar119 = ZEXT816(0);
    auVar113 = auVar119 << 0x40;
    local_b8 = 0;
    local_1b8._192_64_ = ZEXT1664(auVar113);
    local_1b8._128_4_ = auVar113._0_4_;
    local_1b8._128_4_ = 0.0;
    local_1b8._132_4_ = auVar113._4_4_;
    local_1b8._132_4_ = 0.0;
    local_1b8._136_4_ = auVar119._0_4_;
    local_1b8._136_4_ = 0.0;
    local_1b8._140_4_ = auVar119._4_4_;
    local_1b8._140_4_ = 0.0;
    local_1b8._144_8_ = 0;
    local_1b8._152_8_ = 0;
    local_1b8._160_8_ = 0;
    local_1b8._168_8_ = 0;
    local_1b8._176_8_ = 0;
    local_1b8._184_8_ = 0;
    local_1b8._64_8_ = auVar113._0_8_;
    local_1b8._64_8_ = 0;
    local_1b8._72_8_ = 0;
    local_1b8._80_48_ = (undefined1  [48])0x0;
    local_1b8._0_64_ = ZEXT1664(auVar113);
  }
  else {
    in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
    PrimitiveHandle::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_1b8.__align,this_02,&ray->super_Ray,
               INFINITY);
  }
  local_540 = pVVar104 + lVar93;
  local_4e0 = pVVar104 + lVar93 + -1;
  if (((ray->super_Ray).medium.
       super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
       .bits & 0xffffffffffff) != 0) {
    uVar86 = ((ulong)(uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x ^
             0x1a929e4d6f47a654) * -0x395b586ca42e166b;
    uVar87 = ((ulong)(uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y ^
             0x1a929e4d6f47a654) * -0x395b586ca42e166b;
    uVar86 = (uVar86 >> 0x2f ^ uVar86) * -0x395b586ca42e166b;
    uVar86 = uVar86 >> 0x2f ^ uVar86;
    _local_5e8 = ZEXT416((uint)((byte)local_b8 & 1) * local_1b8._248_4_ +
                         (uint)!(bool)((byte)local_b8 & 1) * 0x7f800000);
    uVar87 = (uVar87 >> 0x2f ^ uVar87) * -0x395b586ca42e166b;
    local_4d8 = (undefined1  [8])(uVar86 * 2 + 1);
    uVar86 = ((uVar87 >> 0x2f ^ uVar87) + 1) * 0x5851f42d4c957f2d + uVar86 * -0x4f5c17a566d501a4 + 1
    ;
    uVar87 = (local_528->
             super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
    local_330._0_4_ = (undefined4)uVar87;
    local_330._4_4_ = (undefined4)(uVar87 >> 0x20);
    auVar114 = in_ZMM5._0_16_;
    FVar120 = DispatchSplit<9>::operator()((DispatchSplit<9> *)&local_468,local_330,uVar87 >> 0x30);
    uVar4 = aStack_318._48_8_;
    pSVar80 = local_548;
    uVar3 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
    uVar6 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
    auVar113._4_4_ = uVar6;
    auVar113._0_4_ = uVar3;
    auVar113._8_8_ = 0;
    fVar121 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
    uVar87._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
    uVar87._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar87;
    uVar107 = *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar107;
    TVar8.bits = (ray->super_Ray).medium.
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 .bits;
    local_538._0_4_ = FVar120;
    aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)TVar8.bits;
    uVar211 = aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
    aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
         (float)(TVar8.bits >> 0x20);
    uVar2 = aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aStack_318._48_8_ = uVar4;
    if (0x2ffffffffffff < TVar8.bits) {
      unique0x000f4700 = vmovlhps_avx(auVar111,auVar119);
      if ((TVar8.bits & 0xfffe000000000000) == 0x2000000000000) {
        local_468.terminated = &local_5fd;
        local_468.beta = &local_4c8;
        local_410._0_8_ = vmovlps_avx(auVar113);
        local_468.sampler = local_528;
        local_468.pdfFwd = &local_5d4;
        local_5fc.y = (float)local_5e8._0_4_;
        local_468.vertex = local_540;
        local_468.bounces = &local_5ec;
        local_468.prev = local_4e0;
        local_468.maxDepth = &maxDepth;
        local_468.anyNonSpecularBounces = &local_5fe;
        local_468.ray = local_558;
        local_468.scattered = &local_5ff;
        puVar94 = (undefined8 *)(TVar8.bits & 0xffffffffffff);
        local_410._8_4_ = fVar121;
        local_3f0.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar8.bits;
        Transform::ApplyInverse
                  ((Ray *)local_588,(Transform *)(puVar94 + 0xf),(Ray *)local_410,&local_5fc.y);
        pSVar80 = local_548;
        auVar123._4_4_ = auStack_584._12_4_;
        auVar123._0_4_ = auStack_584._8_4_;
        auVar123._8_8_ = 0;
        auVar261 = (undefined1  [12])0x0;
        auVar113 = ZEXT816(0) << 0x40;
        bVar106 = false;
        uVar85 = 0;
        auVar159._0_4_ = (float)auStack_584._8_4_ * (float)auStack_584._8_4_;
        auVar159._4_4_ = (float)auStack_584._12_4_ * (float)auStack_584._12_4_;
        auVar159._8_8_ = 0;
        auVar119 = vhaddps_avx(auVar159,auVar159);
        auVar119 = ZEXT416((uint)(auVar119._0_4_ +
                                 (float)auStack_584._16_4_ * (float)auStack_584._16_4_));
        auVar119 = vsqrtss_avx(auVar119,auVar119);
        fVar121 = auVar119._0_4_;
        auVar142 = ZEXT464((uint)(fVar121 * local_5fc.y));
        auVar213._4_4_ = fVar121;
        auVar213._0_4_ = fVar121;
        auVar213._8_4_ = fVar121;
        auVar213._12_4_ = fVar121;
        auStack_584._16_4_ = (float)auStack_584._16_4_ / fVar121;
        auVar119 = vdivps_avx(auVar123,auVar213);
        local_5fc.y = fVar121 * local_5fc.y;
        uVar4 = vmovlps_avx(auVar119);
        auStack_584._8_4_ = (undefined4)uVar4;
        auStack_584._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        auVar111 = vmovshdup_avx(auVar119);
        fVar196 = 1.0 / auVar119._0_4_;
        fVar225 = 1.0 / (float)auStack_584._16_4_;
        fVar121 = 1.0 / auVar111._0_4_;
        auVar157 = (undefined1  [56])0x0;
        do {
          auVar119 = ZEXT416((uint)(fVar196 * (*(float *)(puVar94 + 1) - (float)local_588)));
          pfVar88 = (float *)((long)puVar94 + 0x14);
          pfVar100 = (float *)local_588;
          fVar210 = fVar196;
          if (uVar85 != 0) {
            pfVar100 = (float *)auStack_584;
            auVar119 = ZEXT416((uint)(fVar121 *
                                     (*(float *)((long)puVar94 + 0xc) - (float)auStack_584._0_4_)));
            pfVar88 = (float *)(puVar94 + 3);
            fVar210 = fVar121;
            if (uVar85 != 1) {
              pfVar100 = (float *)(auStack_584 + 4);
              auVar119 = ZEXT416((uint)(fVar225 *
                                       (*(float *)(puVar94 + 2) - (float)auStack_584._4_4_)));
              pfVar88 = (float *)((long)puVar94 + 0x1c);
              fVar210 = fVar225;
            }
          }
          auVar114 = ZEXT416((uint)((*pfVar88 - *pfVar100) * fVar210));
          auVar111 = vminss_avx(auVar114,auVar119);
          auVar119 = vmaxss_avx(auVar119,auVar114);
          auVar113 = vmaxss_avx(auVar111,auVar113);
          auVar119 = vminss_avx(ZEXT416((uint)(auVar119._0_4_ * 1.0000004)),auVar142._0_16_);
          auVar142 = ZEXT1664(auVar119);
          if (auVar119._0_4_ < auVar113._0_4_) {
            in_ZMM5 = ZEXT1664(local_5a8);
            if (!bVar106) goto LAB_003f3fbb;
            break;
          }
          bVar106 = 1 < uVar85;
          uVar85 = uVar85 + 1;
        } while (uVar85 != 3);
        uVar1 = *(undefined4 *)(puVar94 + 0xe);
        local_5e8._4_4_ = uVar1;
        local_5e8._0_4_ = uVar1;
        fStack_5e0 = (float)uVar1;
        fStack_5dc = (float)uVar1;
        auVar194 = ZEXT856(local_5e8._8_8_);
        local_4b8._0_4_ = auVar119._0_4_;
        local_4f8 = auVar113;
        SVar265 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar94 + 4),local_548);
        auVar185._0_8_ = SVar265.values.values._8_8_;
        auVar185._8_56_ = auVar157;
        auVar149._0_8_ = SVar265.values.values._0_8_;
        auVar149._8_56_ = auVar194;
        auVar119 = vmovlhps_avx(auVar149._0_16_,auVar185._0_16_);
        fStack_3e0 = auVar119._8_4_ * fStack_5e0;
        fStack_3dc = auVar119._12_4_ * fStack_5dc;
        local_3e8 = (uint *)CONCAT44(auVar119._4_4_ * (float)local_5e8._4_4_,
                                     auVar119._0_4_ * (float)local_5e8._0_4_);
        uVar1 = *(undefined4 *)(puVar94 + 0xe);
        local_5e8._4_4_ = uVar1;
        local_5e8._0_4_ = uVar1;
        fStack_5e0 = (float)uVar1;
        fStack_5dc = (float)uVar1;
        auVar194 = ZEXT856(local_5e8._8_8_);
        SVar265 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar94 + 9),pSVar80);
        uVar1 = aStack_318._60_4_;
        uVar83 = aStack_318._48_8_;
        auVar114 = _local_5e8;
        auVar186._0_8_ = SVar265.values.values._8_8_;
        auVar186._8_56_ = auVar157;
        auVar150._0_8_ = SVar265.values.values._0_8_;
        auVar150._8_56_ = auVar194;
        auVar119 = vmovlhps_avx(auVar150._0_16_,auVar186._0_16_);
        fVar121 = auVar119._0_4_ * (float)local_5e8._0_4_;
        fVar196 = auVar119._4_4_ * (float)local_5e8._4_4_;
        fStack_4a0 = auVar119._8_4_ * fStack_5e0;
        fStack_49c = auVar119._12_4_ * fStack_5dc;
        auVar233._4_4_ = auStack_584._0_4_;
        auVar233._0_4_ = local_588;
        auVar233._8_8_ = 0;
        auVar115 = ZEXT816(0) << 0x40;
        lVar93 = 0;
        local_550 = (uint *)(puVar94 + 0x23);
        local_1c8._0_4_ = fVar121 + (float)local_3e8;
        local_1c8._4_4_ = fVar196 + local_3e8._4_4_;
        local_1c8._8_4_ = fStack_4a0 + fStack_3e0;
        local_1c8._12_4_ = fStack_49c + fStack_3dc;
        auVar142 = ZEXT1664(local_1c8);
        local_4a8 = (uint *)CONCAT44(fVar196,fVar121);
        fVar121 = *(float *)(puVar94 + 2);
        fVar210 = *(float *)((long)puVar94 + 0x1c) - fVar121;
        uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar121),
                               ZEXT416((uint)*(float *)((long)puVar94 + 0x1c)),1);
        bVar12 = (bool)((byte)uVar4 & 1);
        auVar165._8_8_ = 0;
        auVar165._0_8_ = *(ulong *)((long)puVar94 + 0x14);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = puVar94[1];
        auVar119 = vsubps_avx(auVar165,auVar130);
        auVar113 = vsubps_avx(auVar233,auVar130);
        uVar87 = vcmpps_avx512vl(auVar130,auVar165,1);
        auVar131._4_4_ = auStack_584._12_4_;
        auVar131._0_4_ = auStack_584._8_4_;
        auVar131._8_8_ = 0;
        auVar111 = vdivps_avx512vl(auVar113,auVar119);
        bVar106 = (bool)((byte)uVar87 & 1);
        auVar116._0_4_ = (float)((uint)bVar106 * auVar111._0_4_ | (uint)!bVar106 * auVar113._0_4_);
        bVar106 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar116._4_4_ = (uint)bVar106 * auVar111._4_4_ | (uint)!bVar106 * auVar113._4_4_;
        bVar106 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar116._8_4_ = (uint)bVar106 * auVar111._8_4_ | (uint)!bVar106 * auVar113._8_4_;
        bVar106 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar116._12_4_ = (uint)bVar106 * auVar111._12_4_ | (uint)!bVar106 * auVar113._12_4_;
        auVar119 = vdivps_avx(auVar131,auVar119);
        auVar113 = vmovshdup_avx(auVar116);
        local_5fc.x = (float)auStack_584._16_4_ / fVar210;
        uVar4 = vmovlps_avx(auVar119);
        local_5d0.x = (float)uVar4;
        local_5d0.y = SUB84(uVar4,4);
        fVar193 = local_4f8._0_4_;
        auVar111 = vmovshdup_avx(auVar119);
        fVar196 = fVar193 * auVar119._0_4_ + auVar116._0_4_;
        fVar225 = fVar193 * auVar111._0_4_ + auVar113._0_4_;
        iVar108 = *(int *)((long)puVar94 + 0x11c);
        local_5e8._0_4_ = *(undefined4 *)(puVar94 + 0x23);
        local_5e8._4_4_ = 0;
        fVar121 = (float)((uint)bVar12 * (int)(((float)auStack_584._4_4_ - fVar121) / fVar210) +
                         (uint)!bVar12 * (int)((float)auStack_584._4_4_ - fVar121)) +
                  fVar193 * local_5fc.x;
        fVar210 = (float)iVar108;
        _fStack_5e0 = auVar114._8_8_;
        auVar234._0_4_ = (float)(iVar108 + -1);
        auVar234._4_12_ = in_register_00001544;
        puVar103 = (uint *)((long)puVar94 + 0x11c);
        local_3c8._0_8_ = puVar103;
        auVar243._0_4_ = (float)(int)(local_5e8._0_4_ - 1);
        auVar243._4_12_ = in_register_00001544;
        auVar119 = vminss_avx(auVar234,ZEXT416((uint)(fVar225 * fVar210)));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar225 * fVar210)),auVar115,1);
        fVar226 = (float)(int)local_5e8._0_4_;
        uVar85 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
        auVar119 = vminss_avx(auVar243,ZEXT416((uint)(fVar196 * fVar226)));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar196 * fVar226)),auVar115,1);
        fVar229 = (float)*(int *)(puVar94 + 0x24);
        auVar250._0_4_ = (float)(*(int *)(puVar94 + 0x24) + -1);
        auVar250._4_12_ = auVar261;
        uVar92 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
        auVar119 = vminss_avx(auVar250,ZEXT416((uint)(fVar121 * fVar229)));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar121 * fVar229)),auVar115,1);
        uVar96 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
        do {
          iVar109 = (int)lVar93;
          if (iVar109 == 1) {
            local_5c0[1] = uVar85;
            puVar102 = local_51c + 1;
            puVar89 = local_51c + 4;
            pfVar88 = local_504 + 1;
            pfVar100 = local_5b4 + 1;
            pTVar90 = (Tuple3<pbrt::Point3,_float> *)&local_5d0.y;
            uVar98 = uVar85;
          }
          else if (iVar109 == 0) {
            local_5c0[lVar93] = uVar92;
            puVar102 = local_51c;
            puVar89 = local_51c + 3;
            pfVar88 = local_504;
            pfVar100 = local_5b4;
            pTVar90 = &local_5d0;
            uVar98 = uVar92;
          }
          else {
            puVar102 = local_51c + 2;
            puVar89 = local_51c + 5;
            pfVar88 = local_504 + 2;
            pfVar100 = local_5b4 + 2;
            pTVar90 = &local_5fc;
            local_5c0[lVar93] = uVar96;
            uVar98 = uVar96;
          }
          if ((pTVar90->x == 0.0) && (!NAN(pTVar90->x))) {
            pTVar90 = &local_5d0;
            if ((iVar109 != 0) &&
               (pTVar90 = (Tuple3<pbrt::Point3,_float> *)&local_5d0.y, iVar109 != 1)) {
              pTVar90 = &local_5fc;
            }
            pTVar90->x = 0.0;
          }
          pTVar90 = &local_5d0;
          if ((iVar109 != 0) &&
             (pTVar90 = (Tuple3<pbrt::Point3,_float> *)&local_5d0.y, iVar109 != 1)) {
            pTVar90 = &local_5fc;
          }
          if (0.0 <= pTVar90->x) {
            fVar240 = (float)(int)(uVar98 + 1);
            if (iVar109 == 1) {
              *pfVar100 = fVar193 + (fVar240 / fVar210 - fVar225) / local_5d0.y;
              fVar240 = local_5d0.y * fVar210;
              puVar91 = puVar103;
            }
            else if (iVar109 == 0) {
              *pfVar100 = fVar193 + (fVar240 / fVar226 - fVar196) / local_5d0.x;
              fVar240 = local_5d0.x * fVar226;
              puVar91 = local_550;
            }
            else {
              *pfVar100 = fVar193 + (fVar240 / fVar229 - fVar121) / local_5fc.x;
              fVar240 = local_5fc.x * fVar229;
              puVar91 = (uint *)(puVar94 + 0x24);
            }
            *puVar89 = 1;
            *pfVar88 = 1.0 / fVar240;
            uVar98 = *puVar91;
          }
          else {
            fVar240 = (float)(int)uVar98;
            if (iVar109 == 1) {
              fVar240 = fVar240 / fVar210 - fVar225;
              puVar91 = puVar103;
              fVar195 = local_5d0.y;
            }
            else if (iVar109 == 0) {
              fVar240 = fVar240 / fVar226 - fVar196;
              puVar91 = local_550;
              fVar195 = local_5d0.x;
            }
            else {
              fVar240 = fVar240 / fVar229 - fVar121;
              puVar91 = (uint *)(puVar94 + 0x24);
              fVar195 = local_5fc.x;
            }
            *pfVar100 = fVar193 + fVar240 / fVar195;
            uVar99 = *puVar91;
            uVar98 = 0xffffffff;
            *puVar89 = 0xffffffff;
            *pfVar88 = -1.0 / (fVar195 * (float)(int)uVar99);
          }
          lVar93 = lVar93 + 1;
          *puVar102 = uVar98;
        } while (lVar93 != 3);
        in_ZMM5 = ZEXT1664(local_5a8);
        auVar228 = ZEXT464((uint)local_538._0_4_);
        auVar247 = ZEXT464((uint)local_4b8._0_4_);
        aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
             (float)(uVar2 | 0x30000);
        uVar2 = aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
        aStack_318._60_4_ = (uint)((ulong)((long)puVar94 + 0x74) >> 0x20) | 0x10000;
        uVar84 = aStack_318._60_4_;
        auVar97 = local_5e8;
        auVar119 = local_4f8;
        aStack_318._60_4_ = uVar1;
        aStack_318._48_8_ = uVar83;
        while( true ) {
          auVar264 = ZEXT1664(auVar119);
          lVar93 = (long)*(int *)(&DAT_0056d940 +
                                 (ulong)((uint)(local_5b4[1] < local_5b4[2]) |
                                        (uint)(local_5b4[0] < local_5b4[1]) * 4 +
                                        (uint)(local_5b4[0] < local_5b4[2]) * 2) * 4);
          fVar121 = local_5b4[lVar93];
          uVar1 = *(undefined4 *)
                   (puVar94[0x20] +
                   ((long)(int)((iVar108 * local_5c0[2] + local_5c0[1]) * SUB84(auVar97,0)) +
                   (long)(int)local_5c0[0]) * 4);
          auVar47._4_4_ = uVar1;
          auVar47._0_4_ = uVar1;
          auVar47._8_4_ = uVar1;
          auVar47._12_4_ = uVar1;
          auVar111 = vmulps_avx512vl(auVar142._0_16_,auVar47);
          auVar113 = vminss_avx(ZEXT416((uint)fVar121),auVar247._0_16_);
          fVar196 = auVar111._0_4_;
          if ((fVar196 != 0.0) || (NAN(fVar196))) {
            local_3d8._4_4_ = -auVar111._4_4_;
            local_3d8._0_4_ = -fVar196;
            fStack_3d0 = -auVar111._8_4_;
            fStack_3cc = -auVar111._12_4_;
            local_398._0_4_ = auVar113._0_4_;
            local_378._0_4_ = fVar121;
            uVar87 = uVar86;
            _local_5e8 = in_ZMM5._0_16_;
            _local_598 = auVar111;
            while( true ) {
              local_538._0_4_ = auVar264._0_4_;
              fVar121 = logf(1.0 - auVar228._0_4_);
              auVar119 = ZEXT416((uint)local_398._0_4_);
              uVar86 = uVar87 * 0x5851f42d4c957f2d + (long)local_4d8;
              uVar85 = (uint)(uVar87 >> 0x2d) ^ (uint)(uVar87 >> 0x1b);
              bVar76 = (byte)(uVar87 >> 0x3b);
              fVar121 = (float)local_538._0_4_ - fVar121 / (float)local_598._0_4_;
              auVar264 = ZEXT464((uint)fVar121);
              auVar74._4_12_ = in_register_00001544;
              auVar74._0_4_ = in_XMM13_Da;
              auVar113 = vcvtusi2ss_avx512f(auVar74,uVar85 >> bVar76 | uVar85 << 0x20 - bVar76);
              auVar113 = vminss_avx(ZEXT416((uint)(auVar113._0_4_ * 2.3283064e-10)),
                                    ZEXT416(0x3f7fffff));
              auVar228 = ZEXT1664(auVar113);
              if ((float)local_398._0_4_ <= fVar121) break;
              uVar87 = uVar86;
              if (fVar121 < (float)local_4b8._0_4_) {
                fVar196 = fVar121 - (float)local_538._0_4_;
                auVar201._8_4_ = 0x3da00ac9;
                auVar201._0_8_ = 0x3da00ac93da00ac9;
                auVar201._12_4_ = 0x3da00ac9;
                auVar219._8_4_ = 0xffffff81;
                auVar219._0_8_ = 0xffffff81ffffff81;
                auVar219._12_4_ = 0xffffff81;
                local_538._0_4_ = auVar113._0_4_;
                local_4f8 = ZEXT416((uint)fVar121);
                auVar133._0_4_ = fVar196 * (float)local_3d8._0_4_;
                auVar133._4_4_ = fVar196 * (float)local_3d8._4_4_;
                auVar133._8_4_ = fVar196 * fStack_3d0;
                auVar133._12_4_ = fVar196 * fStack_3cc;
                auVar54._8_4_ = 0x3fb8aa3b;
                auVar54._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar54._12_4_ = 0x3fb8aa3b;
                auVar113 = vmulps_avx512vl(auVar133,auVar54);
                auVar119 = vroundps_avx(auVar113,9);
                auVar113 = vsubps_avx(auVar113,auVar119);
                auVar55._8_4_ = 0x3e679a0b;
                auVar55._0_8_ = 0x3e679a0b3e679a0b;
                auVar55._12_4_ = 0x3e679a0b;
                auVar111 = vfmadd213ps_avx512vl(auVar201,auVar113,auVar55);
                auVar166._0_4_ = (int)auVar119._0_4_;
                auVar166._4_4_ = (int)auVar119._4_4_;
                auVar166._8_4_ = (int)auVar119._8_4_;
                auVar166._12_4_ = (int)auVar119._12_4_;
                auVar119 = vpaddd_avx(auVar166,auVar219);
                auVar56._8_4_ = 0x3f321004;
                auVar56._0_8_ = 0x3f3210043f321004;
                auVar56._12_4_ = 0x3f321004;
                auVar111 = vfmadd213ps_avx512vl(auVar111,auVar113,auVar56);
                auVar113 = vfmadd213ps_fma(auVar111,auVar113,local_5a8);
                auVar111 = vpsrld_avx(auVar113,0x17);
                auVar119 = vpaddd_avx(auVar119,auVar111);
                auVar57._8_4_ = 0x807fffff;
                auVar57._0_8_ = 0x807fffff807fffff;
                auVar57._12_4_ = 0x807fffff;
                auVar113 = vpandd_avx512vl(auVar113,auVar57);
                auVar58._8_4_ = 0x7f;
                auVar58._0_8_ = 0x7f0000007f;
                auVar58._12_4_ = 0x7f;
                uVar86 = vpcmpgtd_avx512vl(auVar119,auVar58);
                uVar86 = uVar86 & 0xf;
                uVar107 = vpcmpgtd_avx512vl(auVar119,auVar219);
                uVar107 = uVar107 & 0xf;
                auVar119 = vpslld_avx(auVar119,0x17);
                auVar59._8_4_ = 0x3f800000;
                auVar59._0_8_ = 0x3f8000003f800000;
                auVar59._12_4_ = 0x3f800000;
                auVar119 = vpaddd_avx512vl(auVar119,auVar59);
                auVar119 = vpord_avx512vl(auVar119,auVar113);
                auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar106 = (bool)((byte)uVar86 & 1);
                bVar12 = (bool)((byte)(uVar86 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar86 >> 2) & 1);
                bVar11 = SUB81(uVar86 >> 3,0);
                local_3b8._4_4_ =
                     (uint)bVar12 * auVar113._4_4_ |
                     (uint)!bVar12 * (uint)((byte)(uVar107 >> 1) & 1) * auVar119._4_4_;
                local_3b8._0_4_ =
                     (uint)bVar106 * auVar113._0_4_ |
                     (uint)!bVar106 * (uint)((byte)uVar107 & 1) * auVar119._0_4_;
                fStack_3b0 = (float)((uint)bVar10 * auVar113._8_4_ |
                                    (uint)!bVar10 *
                                    (uint)((byte)(uVar107 >> 2) & 1) * auVar119._8_4_);
                fStack_3ac = (float)((uint)bVar11 * auVar113._12_4_ |
                                    (uint)!bVar11 * (uint)(byte)(uVar107 >> 3) * auVar119._12_4_);
                fVar196 = fVar121 * (float)auStack_584._8_4_ + (float)local_588;
                fVar225 = fVar121 * (float)auStack_584._12_4_ + (float)auStack_584._0_4_;
                _local_498 = CONCAT412(fVar121 * 0.0 + 0.0,
                                       CONCAT48(fVar121 * 0.0 + 0.0,CONCAT44(fVar225,fVar196)));
                _local_478 = vmovshdup_avx(_local_498);
                local_488 = fVar121 * (float)auStack_584._16_4_ + (float)auStack_584._4_4_;
                p_00.super_Tuple3<pbrt::Point3,_float>.z = local_488;
                p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar196;
                p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar225;
                auVar194 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
                auVar157 = ZEXT856(local_498._8_8_);
                SVar265 = CloudMediumProvider::Density
                                    ((CloudMediumProvider *)*puVar94,p_00,local_548);
                auVar187._0_8_ = SVar265.values.values._8_8_;
                auVar187._8_56_ = auVar194;
                auVar151._0_8_ = SVar265.values.values._0_8_;
                auVar151._8_56_ = auVar157;
                auVar119 = vmovlhps_avx(auVar151._0_16_,auVar187._0_16_);
                aStack_318._64_4_ = auVar119._0_4_ * (float)local_3e8;
                aStack_318._68_4_ = auVar119._4_4_ * local_3e8._4_4_;
                aStack_318.ei.super_Interaction.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits._0_4_ = auVar119._8_4_ * fStack_3e0;
                aStack_318.ei.super_Interaction.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits._4_4_ = auVar119._12_4_ * fStack_3dc;
                aStack_318._80_4_ = auVar119._0_4_ * (float)local_4a8;
                aStack_318._84_4_ = auVar119._4_4_ * local_4a8._4_4_;
                aStack_318.mi.sigma_a.values.values[0] = auVar119._8_4_ * fStack_4a0;
                aStack_318.mi.sigma_a.values.values[1] = auVar119._12_4_ * fStack_49c;
                aStack_318.mi.sigma_maj.values.values[2] =
                     (float)local_3b8._0_4_ * (float)local_5e8._0_4_;
                aStack_318.mi.sigma_maj.values.values[3] =
                     (float)local_3b8._4_4_ * (float)local_5e8._4_4_;
                aStack_318.mi.Le.values.values[0] = fStack_3b0 * fStack_5e0;
                aStack_318.mi.Le.values.values[1] = fStack_3ac * fStack_5dc;
                auVar119 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                         *(float *)((long)puVar94 + 0x7c))),
                                           _local_498,ZEXT416(*(uint *)(puVar94 + 0xf)));
                auVar113 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                         *(float *)((long)puVar94 + 0x8c))),
                                           _local_498,ZEXT416(*(uint *)(puVar94 + 0x11)));
                auVar111 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                         *(float *)((long)puVar94 + 0x9c))),
                                           _local_498,ZEXT416(*(uint *)(puVar94 + 0x13)));
                auVar119 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_488),
                                           ZEXT416(*(uint *)(puVar94 + 0x10)));
                auVar113 = vfmadd231ss_fma(auVar113,ZEXT416((uint)local_488),
                                           ZEXT416(*(uint *)(puVar94 + 0x12)));
                auVar111 = vfmadd231ss_fma(auVar111,ZEXT416((uint)local_488),
                                           ZEXT416(*(uint *)(puVar94 + 0x14)));
                auVar114 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                                         *(float *)((long)puVar94 + 0xac))),
                                           _local_498,ZEXT416(*(uint *)(puVar94 + 0x15)));
                fVar121 = auVar119._0_4_ + *(float *)((long)puVar94 + 0x84);
                fVar196 = auVar113._0_4_ + *(float *)((long)puVar94 + 0x94);
                fVar225 = auVar111._0_4_ + *(float *)((long)puVar94 + 0xa4);
                auVar119 = vfmadd231ss_fma(auVar114,ZEXT416((uint)local_488),
                                           ZEXT416(*(uint *)(puVar94 + 0x16)));
                fVar210 = auVar119._0_4_ + *(float *)((long)puVar94 + 0xb4);
                bVar106 = fVar210 == 1.0;
                iVar108 = (uint)bVar106 * (int)fVar225 + (uint)!bVar106 * (int)(fVar225 / fVar210);
                iVar109 = (uint)bVar106 * (int)fVar121 + (uint)!bVar106 * (int)(fVar121 / fVar210);
                iVar110 = (uint)bVar106 * (int)fVar196 + (uint)!bVar106 * (int)(fVar196 / fVar210);
                auVar251._4_4_ = iVar109;
                auVar251._0_4_ = iVar109;
                auVar251._8_4_ = iVar109;
                auVar251._12_4_ = iVar109;
                auVar255._4_4_ = iVar110;
                auVar255._0_4_ = iVar110;
                auVar255._8_4_ = iVar110;
                auVar255._12_4_ = iVar110;
                auVar244._4_4_ = iVar108;
                auVar244._0_4_ = iVar108;
                auVar244._8_4_ = iVar108;
                auVar244._12_4_ = iVar108;
                auVar113 = vmovlhps_avx(auVar251,auVar255);
                aStack_318._16_16_ = ZEXT416(0) << 0x20;
                auVar258._0_4_ = local_410._12_4_ * local_410._12_4_;
                auVar258._4_4_ = local_410._16_4_ * local_410._16_4_;
                auVar258._8_8_ = 0;
                auVar235._0_8_ = local_410._12_8_ ^ 0x8000000080000000;
                auVar235._8_4_ = 0x80000000;
                auVar235._12_4_ = 0x80000000;
                auVar119 = vhaddps_avx(auVar258,auVar258);
                auVar119 = ZEXT416((uint)(auVar119._0_4_ + fStack_3fc * fStack_3fc));
                auVar119 = vsqrtss_avx(auVar119,auVar119);
                fVar121 = auVar119._0_4_;
                auVar259._4_4_ = fVar121;
                auVar259._0_4_ = fVar121;
                auVar259._8_4_ = fVar121;
                auVar259._12_4_ = fVar121;
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = -fStack_3fc / fVar121;
                auVar119 = vdivps_avx(auVar235,auVar259);
                aStack_318.mi.sigma_a.values.values[2] = (float)local_598._0_4_;
                aStack_318.mi.sigma_a.values.values[3] = (float)local_598._4_4_;
                aStack_318.mi.sigma_s.values.values[0] = fStack_590;
                aStack_318.mi.sigma_s.values.values[1] = fStack_58c;
                aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
                local_330._0_4_ = auVar113._0_4_;
                local_330._4_4_ = auVar113._4_4_;
                local_330._8_4_ = auVar113._8_4_;
                local_330._12_4_ = auVar113._12_4_;
                uVar4 = vmovlps_avx(auVar244);
                local_330._16_4_ = (undefined4)uVar4;
                local_330._20_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = FStack_3f8;
                uVar4 = vmovlps_avx(auVar119);
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar4;
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)((ulong)uVar4 >> 0x20);
                aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
                aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
                aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                     (float)((long)puVar94 + 0x74);
                aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                     (float)uVar211;
                aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                     (float)uVar2;
                aStack_318._60_4_ = uVar84;
                aStack_318._112_16_ = aStack_318._16_16_;
                bVar106 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                    (&local_468,(MediumSample *)local_330);
                auVar264 = ZEXT1664(local_4f8);
                auVar228 = ZEXT464((uint)local_538._0_4_);
                _local_5e8 = local_5a8;
                if (!bVar106) goto LAB_003f3fac;
              }
            }
            fVar121 = (float)local_398._0_4_ - (float)local_538._0_4_;
            auVar247 = ZEXT464((uint)local_4b8._0_4_);
            auVar142 = ZEXT1664(local_1c8);
            auVar132._0_4_ = fVar121 * (float)local_3d8._0_4_;
            auVar132._4_4_ = fVar121 * (float)local_3d8._4_4_;
            auVar132._8_4_ = fVar121 * fStack_3d0;
            auVar132._12_4_ = fVar121 * fStack_3cc;
            auVar113 = _local_5e8;
            fVar121 = (float)local_378._0_4_;
          }
          else {
            fVar225 = auVar113._0_4_ - auVar119._0_4_;
            auVar132._0_4_ = fVar225 * -fVar196;
            auVar132._4_4_ = fVar225 * -auVar111._4_4_;
            auVar132._8_4_ = fVar225 * -auVar111._8_4_;
            auVar132._12_4_ = fVar225 * -auVar111._12_4_;
            auVar119 = auVar113;
            auVar113 = in_ZMM5._0_16_;
          }
          auVar218._8_4_ = 0xffffff81;
          auVar218._0_8_ = 0xffffff81ffffff81;
          auVar200._8_4_ = 0x3da00ac9;
          auVar200._0_8_ = 0x3da00ac93da00ac9;
          auVar218._12_4_ = 0xffffff81;
          auVar200._12_4_ = 0x3da00ac9;
          auVar48._8_4_ = 0x3fb8aa3b;
          auVar48._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar48._12_4_ = 0x3fb8aa3b;
          auVar114 = vmulps_avx512vl(auVar132,auVar48);
          auVar111 = vroundps_avx(auVar114,9);
          auVar114 = vsubps_avx(auVar114,auVar111);
          auVar49._8_4_ = 0x3e679a0b;
          auVar49._0_8_ = 0x3e679a0b3e679a0b;
          auVar49._12_4_ = 0x3e679a0b;
          auVar115 = vfmadd213ps_avx512vl(auVar200,auVar114,auVar49);
          auVar167._0_4_ = (int)auVar111._0_4_;
          auVar167._4_4_ = (int)auVar111._4_4_;
          auVar167._8_4_ = (int)auVar111._8_4_;
          auVar167._12_4_ = (int)auVar111._12_4_;
          auVar111 = vpaddd_avx(auVar167,auVar218);
          auVar50._8_4_ = 0x3f321004;
          auVar50._0_8_ = 0x3f3210043f321004;
          auVar50._12_4_ = 0x3f321004;
          auVar115 = vfmadd213ps_avx512vl(auVar115,auVar114,auVar50);
          auVar114 = vfmadd213ps_fma(auVar115,auVar114,local_5a8);
          auVar115 = vpsrld_avx(auVar114,0x17);
          auVar111 = vpaddd_avx(auVar111,auVar115);
          auVar51._8_4_ = 0x7f;
          auVar51._0_8_ = 0x7f0000007f;
          auVar51._12_4_ = 0x7f;
          uVar87 = vpcmpgtd_avx512vl(auVar111,auVar51);
          uVar87 = uVar87 & 0xf;
          auVar52._8_4_ = 0x807fffff;
          auVar52._0_8_ = 0x807fffff807fffff;
          auVar52._12_4_ = 0x807fffff;
          auVar114 = vpandd_avx512vl(auVar114,auVar52);
          uVar107 = vpcmpgtd_avx512vl(auVar111,auVar218);
          uVar107 = uVar107 & 0xf;
          auVar111 = vpslld_avx(auVar111,0x17);
          auVar53._8_4_ = 0x3f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._12_4_ = 0x3f800000;
          auVar111 = vpaddd_avx512vl(auVar111,auVar53);
          auVar111 = vpord_avx512vl(auVar111,auVar114);
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          bVar106 = (bool)((byte)uVar87 & 1);
          bVar12 = (bool)((byte)(uVar87 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar87 >> 2) & 1);
          bVar11 = SUB81(uVar87 >> 3,0);
          in_ZMM5 = ZEXT1664(CONCAT412((float)((uint)bVar11 * auVar114._12_4_ |
                                              (uint)!bVar11 *
                                              (uint)(byte)(uVar107 >> 3) * auVar111._12_4_) *
                                       auVar113._12_4_,
                                       CONCAT48((float)((uint)bVar10 * auVar114._8_4_ |
                                                       (uint)!bVar10 *
                                                       (uint)((byte)(uVar107 >> 2) & 1) *
                                                       auVar111._8_4_) * auVar113._8_4_,
                                                CONCAT44((float)((uint)bVar12 * auVar114._4_4_ |
                                                                (uint)!bVar12 *
                                                                (uint)((byte)(uVar107 >> 1) & 1) *
                                                                auVar111._4_4_) * auVar113._4_4_,
                                                         (float)((uint)bVar106 * auVar114._0_4_ |
                                                                (uint)!bVar106 *
                                                                (uint)((byte)uVar107 & 1) *
                                                                auVar111._0_4_) * auVar113._0_4_))))
          ;
          if ((auVar247._0_4_ < fVar121) ||
             (uVar85 = local_5c0[lVar93], uVar92 = local_51c[lVar93 + 3],
             local_5c0[lVar93] = uVar85 + uVar92, puVar103 = local_550,
             uVar85 + uVar92 == local_51c[lVar93])) break;
          uVar4 = local_3c8._0_8_;
          local_5b4[lVar93] = fVar121 + local_504[lVar93];
          auVar97 = (undefined1  [8])(ulong)*puVar103;
          iVar108 = *(int *)uVar4;
        }
      }
      else {
        local_468.terminated = &local_5fd;
        local_468.beta = &local_4c8;
        local_410._0_8_ = vmovlps_avx(auVar113);
        local_468.sampler = local_528;
        local_468.pdfFwd = &local_5d4;
        local_5fc.x = (float)local_5e8._0_4_;
        local_468.vertex = local_540;
        local_468.bounces = &local_5ec;
        local_468.prev = local_4e0;
        local_468.maxDepth = &maxDepth;
        local_468.anyNonSpecularBounces = &local_5fe;
        local_468.ray = local_558;
        local_468.scattered = &local_5ff;
        puVar94 = (undefined8 *)(TVar8.bits & 0xffffffffffff);
        local_410._8_4_ = fVar121;
        local_3f0.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                   )TVar8.bits;
        Transform::ApplyInverse
                  ((Ray *)local_588,(Transform *)(puVar94 + 0xf),(Ray *)local_410,&local_5fc.x);
        pSVar80 = local_548;
        auVar114._4_4_ = auStack_584._12_4_;
        auVar114._0_4_ = auStack_584._8_4_;
        auVar114._8_8_ = 0;
        auVar261 = (undefined1  [12])0x0;
        auVar113 = ZEXT816(0) << 0x40;
        bVar106 = false;
        uVar85 = 0;
        auVar115._0_4_ = (float)auStack_584._8_4_ * (float)auStack_584._8_4_;
        auVar115._4_4_ = (float)auStack_584._12_4_ * (float)auStack_584._12_4_;
        auVar115._8_8_ = 0;
        auVar119 = vhaddps_avx(auVar115,auVar115);
        auVar119 = ZEXT416((uint)(auVar119._0_4_ +
                                 (float)auStack_584._16_4_ * (float)auStack_584._16_4_));
        auVar119 = vsqrtss_avx(auVar119,auVar119);
        fVar121 = auVar119._0_4_;
        auVar142 = ZEXT464((uint)(fVar121 * local_5fc.x));
        auVar215._4_4_ = fVar121;
        auVar215._0_4_ = fVar121;
        auVar215._8_4_ = fVar121;
        auVar215._12_4_ = fVar121;
        auStack_584._16_4_ = (float)auStack_584._16_4_ / fVar121;
        auVar119 = vdivps_avx(auVar114,auVar215);
        local_5fc.x = fVar121 * local_5fc.x;
        uVar4 = vmovlps_avx(auVar119);
        auStack_584._8_4_ = (undefined4)uVar4;
        auStack_584._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        auVar111 = vmovshdup_avx(auVar119);
        fVar196 = 1.0 / auVar119._0_4_;
        fVar225 = 1.0 / (float)auStack_584._16_4_;
        fVar121 = 1.0 / auVar111._0_4_;
        auVar157 = (undefined1  [56])0x0;
        do {
          auVar119 = ZEXT416((uint)(fVar196 * (*(float *)(puVar94 + 1) - (float)local_588)));
          pfVar88 = (float *)((long)puVar94 + 0x14);
          pfVar100 = (float *)local_588;
          fVar210 = fVar196;
          if (uVar85 != 0) {
            pfVar100 = (float *)auStack_584;
            auVar119 = ZEXT416((uint)(fVar121 *
                                     (*(float *)((long)puVar94 + 0xc) - (float)auStack_584._0_4_)));
            pfVar88 = (float *)(puVar94 + 3);
            fVar210 = fVar121;
            if (uVar85 != 1) {
              pfVar100 = (float *)(auStack_584 + 4);
              auVar119 = ZEXT416((uint)(fVar225 *
                                       (*(float *)(puVar94 + 2) - (float)auStack_584._4_4_)));
              pfVar88 = (float *)((long)puVar94 + 0x1c);
              fVar210 = fVar225;
            }
          }
          auVar114 = ZEXT416((uint)((*pfVar88 - *pfVar100) * fVar210));
          auVar111 = vminss_avx(auVar114,auVar119);
          auVar119 = vmaxss_avx(auVar119,auVar114);
          auVar113 = vmaxss_avx(auVar111,auVar113);
          auVar119 = vminss_avx(ZEXT416((uint)(auVar119._0_4_ * 1.0000004)),auVar142._0_16_);
          auVar142 = ZEXT1664(auVar119);
          if (auVar119._0_4_ < auVar113._0_4_) {
            in_ZMM5 = ZEXT1664(local_5a8);
            if (!bVar106) goto LAB_003f3fbb;
            break;
          }
          bVar106 = 1 < uVar85;
          uVar85 = uVar85 + 1;
        } while (uVar85 != 3);
        uVar211 = *(undefined4 *)(puVar94 + 0xe);
        local_5e8._4_4_ = uVar211;
        local_5e8._0_4_ = uVar211;
        fStack_5e0 = (float)uVar211;
        fStack_5dc = (float)uVar211;
        auVar194 = ZEXT856(local_5e8._8_8_);
        local_4f8._0_4_ = auVar119._0_4_;
        _local_598 = auVar113;
        SVar265 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar94 + 4),local_548);
        auVar188._0_8_ = SVar265.values.values._8_8_;
        auVar188._8_56_ = auVar157;
        auVar247._0_8_ = SVar265.values.values._0_8_;
        auVar247._8_56_ = auVar194;
        auVar119 = vmovlhps_avx(auVar247._0_16_,auVar188._0_16_);
        local_498._4_4_ = auVar119._4_4_ * (float)local_5e8._4_4_;
        local_498._0_4_ = auVar119._0_4_ * (float)local_5e8._0_4_;
        fStack_490 = auVar119._8_4_ * fStack_5e0;
        fStack_48c = auVar119._12_4_ * fStack_5dc;
        uVar211 = *(undefined4 *)(puVar94 + 0xe);
        local_5e8._4_4_ = uVar211;
        local_5e8._0_4_ = uVar211;
        fStack_5e0 = (float)uVar211;
        fStack_5dc = (float)uVar211;
        auVar194 = ZEXT856(local_5e8._8_8_);
        SVar265 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar94 + 9),pSVar80);
        uVar83 = aStack_318._48_8_;
        auVar189._0_8_ = SVar265.values.values._8_8_;
        auVar189._8_56_ = auVar157;
        auVar264._0_8_ = SVar265.values.values._0_8_;
        auVar264._8_56_ = auVar194;
        auVar119 = vmovlhps_avx(auVar264._0_16_,auVar189._0_16_);
        local_3d8._0_4_ = auVar119._0_4_ * (float)local_5e8._0_4_;
        local_3d8._4_4_ = auVar119._4_4_ * (float)local_5e8._4_4_;
        fStack_3d0 = auVar119._8_4_ * fStack_5e0;
        fStack_3cc = auVar119._12_4_ * fStack_5dc;
        auVar236._4_4_ = auStack_584._0_4_;
        auVar236._0_4_ = local_588;
        auVar236._8_8_ = 0;
        auVar114 = ZEXT816(0) << 0x40;
        local_550 = (uint *)((long)puVar94 + 0x11c);
        lVar93 = 0;
        local_4a8 = (uint *)(puVar94 + 0x23);
        local_378._0_4_ = (float)local_3d8._0_4_ + (float)local_498._0_4_;
        local_378._4_4_ = (float)local_3d8._4_4_ + (float)local_498._4_4_;
        local_378._8_4_ = fStack_3d0 + fStack_490;
        local_378._12_4_ = fStack_3cc + fStack_48c;
        auVar142 = ZEXT1664(local_378);
        fVar121 = *(float *)(puVar94 + 2);
        fVar210 = *(float *)((long)puVar94 + 0x1c) - fVar121;
        uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar121),
                               ZEXT416((uint)*(float *)((long)puVar94 + 0x1c)),1);
        bVar12 = (bool)((byte)uVar4 & 1);
        auVar168._8_8_ = 0;
        auVar168._0_8_ = *(ulong *)((long)puVar94 + 0x14);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = puVar94[1];
        auVar119 = vsubps_avx(auVar168,auVar134);
        auVar113 = vsubps_avx(auVar236,auVar134);
        uVar87 = vcmpps_avx512vl(auVar134,auVar168,1);
        auVar135._4_4_ = auStack_584._12_4_;
        auVar135._0_4_ = auStack_584._8_4_;
        auVar135._8_8_ = 0;
        auVar111 = vdivps_avx512vl(auVar113,auVar119);
        bVar106 = (bool)((byte)uVar87 & 1);
        auVar117._0_4_ = (float)((uint)bVar106 * auVar111._0_4_ | (uint)!bVar106 * auVar113._0_4_);
        bVar106 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar117._4_4_ = (uint)bVar106 * auVar111._4_4_ | (uint)!bVar106 * auVar113._4_4_;
        bVar106 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar117._8_4_ = (uint)bVar106 * auVar111._8_4_ | (uint)!bVar106 * auVar113._8_4_;
        bVar106 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar117._12_4_ = (uint)bVar106 * auVar111._12_4_ | (uint)!bVar106 * auVar113._12_4_;
        auVar119 = vdivps_avx(auVar135,auVar119);
        auVar113 = vmovshdup_avx(auVar117);
        local_5f0 = (float)auStack_584._16_4_ / fVar210;
        uVar4 = vmovlps_avx(auVar119);
        local_5fc.y = (float)uVar4;
        local_5fc.z = SUB84(uVar4,4);
        fVar193 = local_598._0_4_;
        auVar111 = vmovshdup_avx(auVar119);
        fVar196 = fVar193 * auVar119._0_4_ + auVar117._0_4_;
        fVar225 = fVar193 * auVar111._0_4_ + auVar113._0_4_;
        uVar85 = *(uint *)((long)puVar94 + 0x11c);
        uVar92 = *(uint *)(puVar94 + 0x23);
        fVar121 = (float)((uint)bVar12 * (int)(((float)auStack_584._4_4_ - fVar121) / fVar210) +
                         (uint)!bVar12 * (int)((float)auStack_584._4_4_ - fVar121)) +
                  fVar193 * local_5f0;
        fVar210 = (float)(int)uVar85;
        auVar237._0_4_ = (float)(int)(uVar85 - 1);
        auVar237._4_12_ = in_register_00001544;
        auVar245._0_4_ = (float)(int)(uVar92 - 1);
        auVar245._4_12_ = in_register_00001544;
        auVar119 = vminss_avx(auVar237,ZEXT416((uint)(fVar225 * fVar210)));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar225 * fVar210)),auVar114,1);
        fVar226 = (float)(int)uVar92;
        uVar96 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
        auVar119 = vminss_avx(auVar245,ZEXT416((uint)(fVar196 * fVar226)));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar196 * fVar226)),auVar114,1);
        fVar229 = (float)*(int *)(puVar94 + 0x24);
        auVar252._0_4_ = (float)(*(int *)(puVar94 + 0x24) + -1);
        auVar252._4_12_ = auVar261;
        uVar98 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
        auVar119 = vminss_avx(auVar252,ZEXT416((uint)(fVar121 * fVar229)));
        uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar121 * fVar229)),auVar114,1);
        uVar99 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
        do {
          iVar108 = (int)lVar93;
          if (iVar108 == 1) {
            local_5c0[1] = uVar96;
            puVar103 = local_51c + 1;
            puVar102 = local_51c + 4;
            pfVar95 = local_504 + 1;
            pfVar100 = local_5b4 + 1;
            pfVar88 = &local_5fc.z;
            uVar105 = uVar96;
          }
          else if (iVar108 == 0) {
            local_5c0[lVar93] = uVar98;
            puVar103 = local_51c;
            puVar102 = local_51c + 3;
            pfVar95 = local_504;
            pfVar100 = local_5b4;
            pfVar88 = &local_5fc.y;
            uVar105 = uVar98;
          }
          else {
            puVar103 = local_51c + 2;
            puVar102 = local_51c + 5;
            pfVar95 = local_504 + 2;
            pfVar100 = local_5b4 + 2;
            pfVar88 = &local_5f0;
            local_5c0[lVar93] = uVar99;
            uVar105 = uVar99;
          }
          if ((*pfVar88 == 0.0) && (!NAN(*pfVar88))) {
            pfVar88 = &local_5fc.y;
            if ((iVar108 != 0) && (pfVar88 = &local_5fc.z, iVar108 != 1)) {
              pfVar88 = &local_5f0;
            }
            *pfVar88 = 0.0;
          }
          pfVar88 = &local_5fc.y;
          if ((iVar108 != 0) && (pfVar88 = &local_5fc.z, iVar108 != 1)) {
            pfVar88 = &local_5f0;
          }
          if (0.0 <= *pfVar88) {
            fVar240 = (float)(int)(uVar105 + 1);
            if (iVar108 == 1) {
              *pfVar100 = fVar193 + (fVar240 / fVar210 - fVar225) / local_5fc.z;
              fVar240 = local_5fc.z * fVar210;
              puVar89 = local_550;
            }
            else if (iVar108 == 0) {
              *pfVar100 = fVar193 + (fVar240 / fVar226 - fVar196) / local_5fc.y;
              fVar240 = local_5fc.y * fVar226;
              puVar89 = local_4a8;
            }
            else {
              *pfVar100 = fVar193 + (fVar240 / fVar229 - fVar121) / local_5f0;
              fVar240 = local_5f0 * fVar229;
              puVar89 = (uint *)(puVar94 + 0x24);
            }
            *puVar102 = 1;
            *pfVar95 = 1.0 / fVar240;
            uVar105 = *puVar89;
          }
          else {
            fVar240 = (float)(int)uVar105;
            if (iVar108 == 1) {
              fVar240 = fVar240 / fVar210 - fVar225;
              puVar89 = local_550;
              fVar195 = local_5fc.z;
            }
            else if (iVar108 == 0) {
              fVar240 = fVar240 / fVar226 - fVar196;
              puVar89 = local_4a8;
              fVar195 = local_5fc.y;
            }
            else {
              fVar240 = fVar240 / fVar229 - fVar121;
              puVar89 = (uint *)(puVar94 + 0x24);
              fVar195 = local_5f0;
            }
            *pfVar100 = fVar193 + fVar240 / fVar195;
            uVar7 = *puVar89;
            *puVar102 = 0xffffffff;
            uVar105 = 0xffffffff;
            *pfVar95 = -1.0 / (fVar195 * (float)(int)uVar7);
          }
          lVar93 = lVar93 + 1;
          *puVar103 = uVar105;
        } while (lVar93 != 3);
        in_ZMM5 = ZEXT1664(local_5a8);
        auVar228 = ZEXT464((uint)local_538._0_4_);
        auVar247 = ZEXT464((uint)local_4f8._0_4_);
        aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
             (float)((uint)((ulong)puVar94 >> 0x20) | 0x40000);
        uVar211 = aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
        local_3e8 = (uint *)((long)puVar94 + 0x74U | 0x1000000000000);
        auVar119 = _local_598;
        aStack_318._48_8_ = uVar83;
        while( true ) {
          auVar264 = ZEXT1664(auVar119);
          lVar93 = (long)*(int *)(&DAT_0056d940 +
                                 (ulong)((uint)(local_5b4[1] < local_5b4[2]) |
                                        (uint)(local_5b4[0] < local_5b4[1]) * 4 +
                                        (uint)(local_5b4[0] < local_5b4[2]) * 2) * 4);
          fVar121 = local_5b4[lVar93];
          auVar113 = vminss_avx(ZEXT416((uint)fVar121),auVar247._0_16_);
          uVar2 = *(undefined4 *)
                   (puVar94[0x20] +
                   ((long)(int)((uVar85 * local_5c0[2] + local_5c0[1]) * uVar92) +
                   (long)(int)local_5c0[0]) * 4);
          auVar60._4_4_ = uVar2;
          auVar60._0_4_ = uVar2;
          auVar60._8_4_ = uVar2;
          auVar60._12_4_ = uVar2;
          auVar111 = vmulps_avx512vl(auVar142._0_16_,auVar60);
          fVar196 = auVar111._0_4_;
          if ((fVar196 != 0.0) || (NAN(fVar196))) {
            _local_398 = auVar111;
            local_4b8._0_4_ = auVar113._0_4_;
            local_3c8._0_4_ = fVar121;
            uVar87 = uVar86;
            _local_5e8 = in_ZMM5._0_16_;
            local_488 = -fVar196;
            fStack_484 = -auVar111._4_4_;
            fStack_480 = -auVar111._8_4_;
            fStack_47c = -auVar111._12_4_;
            while( true ) {
              local_598._0_4_ = auVar264._0_4_;
              fVar121 = logf(1.0 - auVar228._0_4_);
              pSVar80 = local_548;
              auVar119 = ZEXT416((uint)local_4b8._0_4_);
              uVar86 = uVar87 * 0x5851f42d4c957f2d + (long)local_4d8;
              uVar85 = (uint)(uVar87 >> 0x2d) ^ (uint)(uVar87 >> 0x1b);
              bVar76 = (byte)(uVar87 >> 0x3b);
              fVar121 = (float)local_598._0_4_ - fVar121 / (float)local_398._0_4_;
              auVar264 = ZEXT464((uint)fVar121);
              auVar75._4_12_ = in_register_00001544;
              auVar75._0_4_ = in_XMM13_Da;
              auVar113 = vcvtusi2ss_avx512f(auVar75,uVar85 >> bVar76 | uVar85 << 0x20 - bVar76);
              auVar113 = vminss_avx(ZEXT416((uint)(auVar113._0_4_ * 2.3283064e-10)),
                                    ZEXT416(0x3f7fffff));
              auVar228 = ZEXT1664(auVar113);
              if ((float)local_4b8._0_4_ <= fVar121) break;
              uVar87 = uVar86;
              if (fVar121 < (float)local_4f8._0_4_) {
                fVar196 = fVar121 - (float)local_598._0_4_;
                auVar203._8_4_ = 0x3da00ac9;
                auVar203._0_8_ = 0x3da00ac93da00ac9;
                auVar203._12_4_ = 0x3da00ac9;
                auVar221._8_4_ = 0xffffff81;
                auVar221._0_8_ = 0xffffff81ffffff81;
                auVar221._12_4_ = 0xffffff81;
                local_538._0_4_ = auVar113._0_4_;
                _local_598 = ZEXT416((uint)fVar121);
                auVar137._0_4_ = fVar196 * local_488;
                auVar137._4_4_ = fVar196 * fStack_484;
                auVar137._8_4_ = fVar196 * fStack_480;
                auVar137._12_4_ = fVar196 * fStack_47c;
                auVar67._8_4_ = 0x3fb8aa3b;
                auVar67._0_8_ = 0x3fb8aa3b3fb8aa3b;
                auVar67._12_4_ = 0x3fb8aa3b;
                auVar113 = vmulps_avx512vl(auVar137,auVar67);
                auVar119 = vroundps_avx(auVar113,9);
                auVar113 = vsubps_avx(auVar113,auVar119);
                auVar68._8_4_ = 0x3e679a0b;
                auVar68._0_8_ = 0x3e679a0b3e679a0b;
                auVar68._12_4_ = 0x3e679a0b;
                auVar111 = vfmadd213ps_avx512vl(auVar203,auVar113,auVar68);
                auVar169._0_4_ = (int)auVar119._0_4_;
                auVar169._4_4_ = (int)auVar119._4_4_;
                auVar169._8_4_ = (int)auVar119._8_4_;
                auVar169._12_4_ = (int)auVar119._12_4_;
                auVar119 = vpaddd_avx(auVar169,auVar221);
                auVar69._8_4_ = 0x3f321004;
                auVar69._0_8_ = 0x3f3210043f321004;
                auVar69._12_4_ = 0x3f321004;
                auVar111 = vfmadd213ps_avx512vl(auVar111,auVar113,auVar69);
                auVar113 = vfmadd213ps_fma(auVar111,auVar113,local_5a8);
                auVar111 = vpsrld_avx(auVar113,0x17);
                auVar119 = vpaddd_avx(auVar119,auVar111);
                auVar70._8_4_ = 0x807fffff;
                auVar70._0_8_ = 0x807fffff807fffff;
                auVar70._12_4_ = 0x807fffff;
                auVar113 = vpandd_avx512vl(auVar113,auVar70);
                auVar71._8_4_ = 0x7f;
                auVar71._0_8_ = 0x7f0000007f;
                auVar71._12_4_ = 0x7f;
                uVar86 = vpcmpgtd_avx512vl(auVar119,auVar71);
                uVar86 = uVar86 & 0xf;
                uVar107 = vpcmpgtd_avx512vl(auVar119,auVar221);
                uVar107 = uVar107 & 0xf;
                auVar119 = vpslld_avx(auVar119,0x17);
                auVar72._8_4_ = 0x3f800000;
                auVar72._0_8_ = 0x3f8000003f800000;
                auVar72._12_4_ = 0x3f800000;
                auVar119 = vpaddd_avx512vl(auVar119,auVar72);
                auVar119 = vpord_avx512vl(auVar119,auVar113);
                auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                bVar106 = (bool)((byte)uVar86 & 1);
                bVar12 = (bool)((byte)(uVar86 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar86 >> 2) & 1);
                bVar11 = SUB81(uVar86 >> 3,0);
                auVar170._0_4_ = fVar121 * (float)auStack_584._8_4_ + (float)local_588;
                auVar170._4_4_ = fVar121 * (float)auStack_584._12_4_ + (float)auStack_584._0_4_;
                auVar170._8_4_ = fVar121 * 0.0 + 0.0;
                auVar170._12_4_ = fVar121 * 0.0 + 0.0;
                auVar194 = ZEXT856(auVar170._8_8_);
                local_3b8._4_4_ =
                     (uint)bVar12 * auVar113._4_4_ |
                     (uint)!bVar12 * (uint)((byte)(uVar107 >> 1) & 1) * auVar119._4_4_;
                local_3b8._0_4_ =
                     (uint)bVar106 * auVar113._0_4_ |
                     (uint)!bVar106 * (uint)((byte)uVar107 & 1) * auVar119._0_4_;
                fStack_3b0 = (float)((uint)bVar10 * auVar113._8_4_ |
                                    (uint)!bVar10 *
                                    (uint)((byte)(uVar107 >> 2) & 1) * auVar119._8_4_);
                fStack_3ac = (float)((uint)bVar11 * auVar113._12_4_ |
                                    (uint)!bVar11 * (uint)(byte)(uVar107 >> 3) * auVar119._12_4_);
                local_5d0._0_8_ = vmovlps_avx(auVar170);
                local_5d0.z = fVar121 * (float)auStack_584._16_4_ + (float)auStack_584._4_4_;
                auVar157 = (undefined1  [56])0x0;
                SVar265 = NanoVDBMediumProvider::Density
                                    ((NanoVDBMediumProvider *)*puVar94,(Point3f *)&local_5d0,
                                     local_548);
                auVar190._0_8_ = SVar265.values.values._8_8_;
                auVar190._8_56_ = auVar194;
                auVar152._0_8_ = SVar265.values.values._0_8_;
                auVar152._8_56_ = auVar157;
                _local_478 = vmovlhps_avx(auVar152._0_16_,auVar190._0_16_);
                auVar157 = ZEXT856(local_478._8_8_);
                SVar265 = NanoVDBMediumProvider::Le
                                    ((NanoVDBMediumProvider *)*puVar94,(Point3f *)&local_5d0,pSVar80
                                    );
                auVar191._0_8_ = SVar265.values.values._8_8_;
                auVar191._8_56_ = auVar194;
                auVar153._0_8_ = SVar265.values.values._0_8_;
                auVar153._8_56_ = auVar157;
                aStack_318._64_4_ = (float)local_478._0_4_ * (float)local_498._0_4_;
                aStack_318._68_4_ = (float)local_478._4_4_ * (float)local_498._4_4_;
                aStack_318.ei.super_Interaction.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits._0_4_ = fStack_470 * fStack_490;
                aStack_318.ei.super_Interaction.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                .bits._4_4_ = fStack_46c * fStack_48c;
                aStack_318._80_4_ = (float)local_478._0_4_ * (float)local_3d8._0_4_;
                aStack_318._84_4_ = (float)local_478._4_4_ * (float)local_3d8._4_4_;
                aStack_318.mi.sigma_a.values.values[0] = fStack_470 * fStack_3d0;
                aStack_318.mi.sigma_a.values.values[1] = fStack_46c * fStack_3cc;
                aStack_318.mi.sigma_maj.values.values[2] =
                     (float)local_3b8._0_4_ * (float)local_5e8._0_4_;
                aStack_318.mi.sigma_maj.values.values[3] =
                     (float)local_3b8._4_4_ * (float)local_5e8._4_4_;
                aStack_318.mi.Le.values.values[0] = fStack_3b0 * fStack_5e0;
                aStack_318.mi.Le.values.values[1] = fStack_3ac * fStack_5dc;
                auVar119 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                         *(float *)((long)puVar94 + 0x7c))),
                                           ZEXT416((uint)local_5d0.x),
                                           ZEXT416(*(uint *)(puVar94 + 0xf)));
                auVar113 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                         *(float *)((long)puVar94 + 0xac))),
                                           ZEXT416((uint)local_5d0.x),
                                           ZEXT416(*(uint *)(puVar94 + 0x15)));
                auVar111 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                         *(float *)((long)puVar94 + 0x8c))),
                                           ZEXT416((uint)local_5d0.x),
                                           ZEXT416(*(uint *)(puVar94 + 0x11)));
                auVar114 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                         *(float *)((long)puVar94 + 0x9c))),
                                           ZEXT416((uint)local_5d0.x),
                                           ZEXT416(*(uint *)(puVar94 + 0x13)));
                auVar119 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_5d0.z),
                                           ZEXT416(*(uint *)(puVar94 + 0x10)));
                auVar113 = vfmadd231ss_fma(auVar113,ZEXT416((uint)local_5d0.z),
                                           ZEXT416(*(uint *)(puVar94 + 0x16)));
                auVar111 = vfmadd231ss_fma(auVar111,ZEXT416((uint)local_5d0.z),
                                           ZEXT416(*(uint *)(puVar94 + 0x12)));
                auVar114 = vfmadd231ss_fma(auVar114,ZEXT416((uint)local_5d0.z),
                                           ZEXT416(*(uint *)(puVar94 + 0x14)));
                fVar121 = auVar113._0_4_ + *(float *)((long)puVar94 + 0xb4);
                fVar196 = auVar119._0_4_ + *(float *)((long)puVar94 + 0x84);
                fVar225 = auVar111._0_4_ + *(float *)((long)puVar94 + 0x94);
                fVar210 = auVar114._0_4_ + *(float *)((long)puVar94 + 0xa4);
                bVar106 = fVar121 == 1.0;
                iVar108 = (uint)bVar106 * (int)fVar196 + (uint)!bVar106 * (int)(fVar196 / fVar121);
                iVar109 = (uint)bVar106 * (int)fVar210 + (uint)!bVar106 * (int)(fVar210 / fVar121);
                iVar110 = (uint)bVar106 * (int)fVar225 + (uint)!bVar106 * (int)(fVar225 / fVar121);
                auVar246._4_4_ = iVar108;
                auVar246._0_4_ = iVar108;
                auVar246._8_4_ = iVar108;
                auVar246._12_4_ = iVar108;
                auVar253._4_4_ = iVar110;
                auVar253._0_4_ = iVar110;
                auVar253._8_4_ = iVar110;
                auVar253._12_4_ = iVar110;
                auVar238._4_4_ = iVar109;
                auVar238._0_4_ = iVar109;
                auVar238._8_4_ = iVar109;
                auVar238._12_4_ = iVar109;
                auVar113 = vmovlhps_avx(auVar246,auVar253);
                aStack_318._16_16_ = ZEXT416(0) << 0x20;
                auVar260._0_4_ = local_410._12_4_ * local_410._12_4_;
                auVar260._4_4_ = local_410._16_4_ * local_410._16_4_;
                auVar260._8_8_ = 0;
                auVar256._0_8_ = local_410._12_8_ ^ 0x8000000080000000;
                auVar256._8_4_ = 0x80000000;
                auVar256._12_4_ = 0x80000000;
                auVar119 = vhaddps_avx(auVar260,auVar260);
                aStack_318.mi.sigma_a.values.values[2] = local_398._0_4_;
                aStack_318.mi.sigma_a.values.values[3] = local_398._4_4_;
                aStack_318.mi.sigma_s.values.values[0] = local_398._8_4_;
                aStack_318.mi.sigma_s.values.values[1] = local_398._12_4_;
                aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
                local_330._0_4_ = auVar113._0_4_;
                local_330._4_4_ = auVar113._4_4_;
                local_330._8_4_ = auVar113._8_4_;
                local_330._12_4_ = auVar113._12_4_;
                uVar4 = vmovlps_avx(auVar238);
                local_330._16_4_ = (undefined4)uVar4;
                local_330._20_4_ = (undefined4)((ulong)uVar4 >> 0x20);
                auVar119 = ZEXT416((uint)(auVar119._0_4_ + fStack_3fc * fStack_3fc));
                auVar119 = vsqrtss_avx(auVar119,auVar119);
                aStack_318._112_16_ = vmovlhps_avx(auVar153._0_16_,auVar191._0_16_);
                fVar121 = auVar119._0_4_;
                auVar263._4_4_ = fVar121;
                auVar263._0_4_ = fVar121;
                auVar263._8_4_ = fVar121;
                auVar263._12_4_ = fVar121;
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = -fStack_3fc / fVar121;
                auVar119 = vdivps_avx(auVar256,auVar263);
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = FStack_3f8;
                uVar4 = vmovlps_avx(auVar119);
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar4;
                aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)((ulong)uVar4 >> 0x20);
                aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
                aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
                aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                     SUB84(puVar94,0);
                aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                     SUB84(local_3e8,0);
                aStack_318._60_4_ = (undefined4)((ulong)local_3e8 >> 0x20);
                aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
                     (float)uVar211;
                bVar106 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                    (&local_468,(MediumSample *)local_330);
                if (!bVar106) goto LAB_003f3fac;
                auVar228 = ZEXT464((uint)local_538._0_4_);
                auVar264 = ZEXT1664(_local_598);
                _local_5e8 = local_5a8;
              }
            }
            fVar121 = (float)local_4b8._0_4_ - (float)local_598._0_4_;
            auVar247 = ZEXT464((uint)local_4f8._0_4_);
            auVar142 = ZEXT1664(local_378);
            auVar136._0_4_ = fVar121 * local_488;
            auVar136._4_4_ = fVar121 * fStack_484;
            auVar136._8_4_ = fVar121 * fStack_480;
            auVar136._12_4_ = fVar121 * fStack_47c;
            fVar121 = (float)local_3c8._0_4_;
            auVar113 = _local_5e8;
          }
          else {
            fVar225 = auVar113._0_4_ - auVar119._0_4_;
            auVar136._0_4_ = fVar225 * -fVar196;
            auVar136._4_4_ = fVar225 * -auVar111._4_4_;
            auVar136._8_4_ = fVar225 * -auVar111._8_4_;
            auVar136._12_4_ = fVar225 * -auVar111._12_4_;
            auVar119 = auVar113;
            auVar113 = in_ZMM5._0_16_;
          }
          auVar220._8_4_ = 0xffffff81;
          auVar220._0_8_ = 0xffffff81ffffff81;
          auVar202._8_4_ = 0x3da00ac9;
          auVar202._0_8_ = 0x3da00ac93da00ac9;
          auVar220._12_4_ = 0xffffff81;
          auVar202._12_4_ = 0x3da00ac9;
          auVar61._8_4_ = 0x3fb8aa3b;
          auVar61._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar61._12_4_ = 0x3fb8aa3b;
          auVar114 = vmulps_avx512vl(auVar136,auVar61);
          auVar111 = vroundps_avx(auVar114,9);
          auVar114 = vsubps_avx(auVar114,auVar111);
          auVar62._8_4_ = 0x3e679a0b;
          auVar62._0_8_ = 0x3e679a0b3e679a0b;
          auVar62._12_4_ = 0x3e679a0b;
          auVar115 = vfmadd213ps_avx512vl(auVar202,auVar114,auVar62);
          auVar171._0_4_ = (int)auVar111._0_4_;
          auVar171._4_4_ = (int)auVar111._4_4_;
          auVar171._8_4_ = (int)auVar111._8_4_;
          auVar171._12_4_ = (int)auVar111._12_4_;
          auVar111 = vpaddd_avx(auVar171,auVar220);
          auVar63._8_4_ = 0x3f321004;
          auVar63._0_8_ = 0x3f3210043f321004;
          auVar63._12_4_ = 0x3f321004;
          auVar115 = vfmadd213ps_avx512vl(auVar115,auVar114,auVar63);
          auVar114 = vfmadd213ps_fma(auVar115,auVar114,local_5a8);
          auVar115 = vpsrld_avx(auVar114,0x17);
          auVar111 = vpaddd_avx(auVar111,auVar115);
          auVar64._8_4_ = 0x7f;
          auVar64._0_8_ = 0x7f0000007f;
          auVar64._12_4_ = 0x7f;
          uVar87 = vpcmpgtd_avx512vl(auVar111,auVar64);
          uVar87 = uVar87 & 0xf;
          auVar65._8_4_ = 0x807fffff;
          auVar65._0_8_ = 0x807fffff807fffff;
          auVar65._12_4_ = 0x807fffff;
          auVar114 = vpandd_avx512vl(auVar114,auVar65);
          uVar107 = vpcmpgtd_avx512vl(auVar111,auVar220);
          uVar107 = uVar107 & 0xf;
          auVar111 = vpslld_avx(auVar111,0x17);
          auVar66._8_4_ = 0x3f800000;
          auVar66._0_8_ = 0x3f8000003f800000;
          auVar66._12_4_ = 0x3f800000;
          auVar111 = vpaddd_avx512vl(auVar111,auVar66);
          auVar111 = vpord_avx512vl(auVar111,auVar114);
          auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          bVar106 = (bool)((byte)uVar87 & 1);
          bVar12 = (bool)((byte)(uVar87 >> 1) & 1);
          bVar10 = (bool)((byte)(uVar87 >> 2) & 1);
          bVar11 = SUB81(uVar87 >> 3,0);
          in_ZMM5 = ZEXT1664(CONCAT412((float)((uint)bVar11 * auVar114._12_4_ |
                                              (uint)!bVar11 *
                                              (uint)(byte)(uVar107 >> 3) * auVar111._12_4_) *
                                       auVar113._12_4_,
                                       CONCAT48((float)((uint)bVar10 * auVar114._8_4_ |
                                                       (uint)!bVar10 *
                                                       (uint)((byte)(uVar107 >> 2) & 1) *
                                                       auVar111._8_4_) * auVar113._8_4_,
                                                CONCAT44((float)((uint)bVar12 * auVar114._4_4_ |
                                                                (uint)!bVar12 *
                                                                (uint)((byte)(uVar107 >> 1) & 1) *
                                                                auVar111._4_4_) * auVar113._4_4_,
                                                         (float)((uint)bVar106 * auVar114._0_4_ |
                                                                (uint)!bVar106 *
                                                                (uint)((byte)uVar107 & 1) *
                                                                auVar111._0_4_) * auVar113._0_4_))))
          ;
          if ((auVar247._0_4_ < fVar121) ||
             (uVar85 = local_5c0[lVar93], uVar92 = local_51c[lVar93 + 3],
             local_5c0[lVar93] = uVar85 + uVar92, puVar102 = local_4a8, puVar103 = local_550,
             uVar85 + uVar92 == local_51c[lVar93])) break;
          local_5b4[lVar93] = fVar121 + local_504[lVar93];
          uVar92 = *puVar102;
          uVar85 = *puVar103;
        }
      }
      goto LAB_003f3fbb;
    }
    if ((TVar8.bits & 0x3000000000000) == 0x2000000000000) {
      local_468.terminated = &local_5fd;
      local_468.beta = &local_4c8;
      unique0x000f4700 = vmovlhps_avx(auVar111,auVar119);
      local_410._0_8_ = vmovlps_avx(auVar113);
      local_468.sampler = local_528;
      local_468.pdfFwd = &local_5d4;
      local_5fc.x = (float)local_5e8._0_4_;
      local_468.vertex = local_540;
      local_468.bounces = &local_5ec;
      local_468.prev = local_4e0;
      local_468.maxDepth = &maxDepth;
      local_468.anyNonSpecularBounces = &local_5fe;
      local_468.ray = local_558;
      local_468.scattered = &local_5ff;
      puVar94 = (undefined8 *)(TVar8.bits & 0xffffffffffff);
      local_410._8_4_ = fVar121;
      local_3f0.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )TVar8.bits;
      Transform::ApplyInverse
                ((Ray *)local_588,(Transform *)(puVar94 + 0xf),(Ray *)local_410,&local_5fc.x);
      pSVar80 = local_548;
      auVar122._4_4_ = auStack_584._12_4_;
      auVar122._0_4_ = auStack_584._8_4_;
      auVar122._8_8_ = 0;
      auVar261 = (undefined1  [12])0x0;
      auVar113 = ZEXT816(0) << 0x40;
      bVar106 = false;
      uVar85 = 0;
      auVar158._0_4_ = (float)auStack_584._8_4_ * (float)auStack_584._8_4_;
      auVar158._4_4_ = (float)auStack_584._12_4_ * (float)auStack_584._12_4_;
      auVar158._8_8_ = 0;
      auVar119 = vhaddps_avx(auVar158,auVar158);
      auVar119 = ZEXT416((uint)(auVar119._0_4_ +
                               (float)auStack_584._16_4_ * (float)auStack_584._16_4_));
      auVar119 = vsqrtss_avx(auVar119,auVar119);
      fVar121 = auVar119._0_4_;
      auVar142 = ZEXT464((uint)(fVar121 * local_5fc.x));
      auVar212._4_4_ = fVar121;
      auVar212._0_4_ = fVar121;
      auVar212._8_4_ = fVar121;
      auVar212._12_4_ = fVar121;
      auStack_584._16_4_ = (float)auStack_584._16_4_ / fVar121;
      auVar119 = vdivps_avx(auVar122,auVar212);
      local_5fc.x = fVar121 * local_5fc.x;
      uVar4 = vmovlps_avx(auVar119);
      auStack_584._8_4_ = (undefined4)uVar4;
      auStack_584._12_4_ = (undefined4)((ulong)uVar4 >> 0x20);
      auVar111 = vmovshdup_avx(auVar119);
      fVar196 = 1.0 / auVar119._0_4_;
      fVar225 = 1.0 / (float)auStack_584._16_4_;
      fVar121 = 1.0 / auVar111._0_4_;
      auVar157 = (undefined1  [56])0x0;
      do {
        auVar119 = ZEXT416((uint)(fVar196 * (*(float *)(puVar94 + 1) - (float)local_588)));
        pfVar100 = (float *)((long)puVar94 + 0x14);
        pRVar101 = (Ray *)local_588;
        fVar210 = fVar196;
        if (uVar85 != 0) {
          pRVar101 = (Ray *)auStack_584;
          auVar119 = ZEXT416((uint)(fVar121 *
                                   (*(float *)((long)puVar94 + 0xc) - (float)auStack_584._0_4_)));
          pfVar100 = (float *)(puVar94 + 3);
          fVar210 = fVar121;
          if (uVar85 != 1) {
            pRVar101 = (Ray *)(auStack_584 + 4);
            auVar119 = ZEXT416((uint)(fVar225 * (*(float *)(puVar94 + 2) - (float)auStack_584._4_4_)
                                     ));
            pfVar100 = (float *)((long)puVar94 + 0x1c);
            fVar210 = fVar225;
          }
        }
        auVar114 = ZEXT416((uint)((*pfVar100 - (pRVar101->o).super_Tuple3<pbrt::Point3,_float>.x) *
                                 fVar210));
        auVar111 = vminss_avx(auVar114,auVar119);
        auVar119 = vmaxss_avx(auVar119,auVar114);
        auVar113 = vmaxss_avx(auVar111,auVar113);
        auVar119 = vminss_avx(ZEXT416((uint)(auVar119._0_4_ * 1.0000004)),auVar142._0_16_);
        auVar142 = ZEXT1664(auVar119);
        if (auVar119._0_4_ < auVar113._0_4_) {
          in_ZMM5 = ZEXT1664(local_5a8);
          if (!bVar106) goto LAB_003f3fbb;
          break;
        }
        bVar106 = 1 < uVar85;
        uVar85 = uVar85 + 1;
      } while (uVar85 != 3);
      uVar1 = *(undefined4 *)(puVar94 + 0xe);
      local_5e8._4_4_ = uVar1;
      local_5e8._0_4_ = uVar1;
      fStack_5e0 = (float)uVar1;
      fStack_5dc = (float)uVar1;
      auVar194 = ZEXT856(local_5e8._8_8_);
      local_4f8._0_4_ = auVar119._0_4_;
      _local_598 = auVar113;
      SVar265 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar94 + 4),local_548);
      auVar181._0_8_ = SVar265.values.values._8_8_;
      auVar181._8_56_ = auVar157;
      auVar145._0_8_ = SVar265.values.values._0_8_;
      auVar145._8_56_ = auVar194;
      auVar119 = vmovlhps_avx(auVar145._0_16_,auVar181._0_16_);
      local_498._4_4_ = auVar119._4_4_ * (float)local_5e8._4_4_;
      local_498._0_4_ = auVar119._0_4_ * (float)local_5e8._0_4_;
      fStack_490 = auVar119._8_4_ * fStack_5e0;
      fStack_48c = auVar119._12_4_ * fStack_5dc;
      uVar1 = *(undefined4 *)(puVar94 + 0xe);
      local_5e8._4_4_ = uVar1;
      local_5e8._0_4_ = uVar1;
      fStack_5e0 = (float)uVar1;
      fStack_5dc = (float)uVar1;
      auVar194 = ZEXT856(local_5e8._8_8_);
      SVar265 = DenselySampledSpectrum::Sample((DenselySampledSpectrum *)(puVar94 + 9),pSVar80);
      uVar1 = aStack_318._60_4_;
      auVar182._0_8_ = SVar265.values.values._8_8_;
      auVar182._8_56_ = auVar157;
      auVar146._0_8_ = SVar265.values.values._0_8_;
      auVar146._8_56_ = auVar194;
      auVar119 = vmovlhps_avx(auVar146._0_16_,auVar182._0_16_);
      local_3d8._0_4_ = auVar119._0_4_ * (float)local_5e8._0_4_;
      local_3d8._4_4_ = auVar119._4_4_ * (float)local_5e8._4_4_;
      fStack_3d0 = auVar119._8_4_ * fStack_5e0;
      fStack_3cc = auVar119._12_4_ * fStack_5dc;
      auVar230._4_4_ = auStack_584._0_4_;
      auVar230._0_4_ = local_588;
      auVar230._8_8_ = 0;
      auVar114 = ZEXT816(0) << 0x40;
      lVar93 = 0;
      local_3e8 = (uint *)(puVar94 + 0x23);
      local_3c8._0_4_ = (float)local_3d8._0_4_ + (float)local_498._0_4_;
      local_3c8._4_4_ = (float)local_3d8._4_4_ + (float)local_498._4_4_;
      local_3c8._8_4_ = fStack_3d0 + fStack_490;
      local_3c8._12_4_ = fStack_3cc + fStack_48c;
      auVar142 = ZEXT1664(local_3c8);
      fVar121 = *(float *)(puVar94 + 2);
      fVar210 = *(float *)((long)puVar94 + 0x1c) - fVar121;
      uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar121),ZEXT416((uint)*(float *)((long)puVar94 + 0x1c)),
                             1);
      bVar12 = (bool)((byte)uVar4 & 1);
      auVar161._8_8_ = 0;
      auVar161._0_8_ = *(ulong *)((long)puVar94 + 0x14);
      auVar126._8_8_ = 0;
      auVar126._0_8_ = puVar94[1];
      auVar119 = vsubps_avx(auVar161,auVar126);
      auVar113 = vsubps_avx(auVar230,auVar126);
      uVar87 = vcmpps_avx512vl(auVar126,auVar161,1);
      auVar127._4_4_ = auStack_584._12_4_;
      auVar127._0_4_ = auStack_584._8_4_;
      auVar127._8_8_ = 0;
      auVar111 = vdivps_avx512vl(auVar113,auVar119);
      bVar106 = (bool)((byte)uVar87 & 1);
      auVar112._0_4_ = (float)((uint)bVar106 * auVar111._0_4_ | (uint)!bVar106 * auVar113._0_4_);
      bVar106 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar106 * auVar111._4_4_ | (uint)!bVar106 * auVar113._4_4_;
      bVar106 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar106 * auVar111._8_4_ | (uint)!bVar106 * auVar113._8_4_;
      bVar106 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar106 * auVar111._12_4_ | (uint)!bVar106 * auVar113._12_4_;
      auVar119 = vdivps_avx(auVar127,auVar119);
      auVar113 = vmovshdup_avx(auVar112);
      local_5f0 = (float)auStack_584._16_4_ / fVar210;
      uVar4 = vmovlps_avx(auVar119);
      local_5fc.y = (float)uVar4;
      local_5fc.z = SUB84(uVar4,4);
      fVar193 = local_598._0_4_;
      auVar111 = vmovshdup_avx(auVar119);
      fVar196 = fVar193 * auVar119._0_4_ + auVar112._0_4_;
      fVar225 = fVar193 * auVar111._0_4_ + auVar113._0_4_;
      uVar85 = *(uint *)((long)puVar94 + 0x11c);
      uVar92 = *(uint *)(puVar94 + 0x23);
      uVar87 = CONCAT44(0,uVar92);
      fVar121 = (float)((uint)bVar12 * (int)(((float)auStack_584._4_4_ - fVar121) / fVar210) +
                       (uint)!bVar12 * (int)((float)auStack_584._4_4_ - fVar121)) +
                fVar193 * local_5f0;
      fVar210 = (float)(int)uVar85;
      local_5e8 = (undefined1  [8])uVar87;
      auVar231._0_4_ = (float)(int)(uVar85 - 1);
      auVar231._4_12_ = in_register_00001544;
      local_4a8 = (uint *)((long)puVar94 + 0x11c);
      auVar241._0_4_ = (float)(int)(uVar92 - 1);
      auVar241._4_12_ = in_register_00001544;
      auVar119 = vminss_avx(auVar231,ZEXT416((uint)(fVar225 * fVar210)));
      uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar225 * fVar210)),auVar114,1);
      fVar226 = (float)(int)uVar92;
      uVar92 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
      auVar119 = vminss_avx(auVar241,ZEXT416((uint)(fVar196 * fVar226)));
      uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar196 * fVar226)),auVar114,1);
      fVar229 = (float)*(int *)(puVar94 + 0x24);
      auVar248._0_4_ = (float)(*(int *)(puVar94 + 0x24) + -1);
      auVar248._4_12_ = auVar261;
      uVar96 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
      auVar119 = vminss_avx(auVar248,ZEXT416((uint)(fVar121 * fVar229)));
      uVar4 = vcmpss_avx512f(ZEXT416((uint)(fVar121 * fVar229)),auVar114,1);
      uVar98 = (uint)(float)((uint)!(bool)((byte)uVar4 & 1) * auVar119._0_4_);
      do {
        iVar108 = (int)lVar93;
        if (iVar108 == 1) {
          local_5c0[1] = uVar92;
          puVar103 = local_51c + 1;
          puVar102 = local_51c + 4;
          pfVar95 = local_504 + 1;
          pfVar100 = local_5b4 + 1;
          pfVar88 = &local_5fc.z;
          uVar99 = uVar92;
        }
        else if (iVar108 == 0) {
          local_5c0[lVar93] = uVar96;
          puVar103 = local_51c;
          puVar102 = local_51c + 3;
          pfVar95 = local_504;
          pfVar100 = local_5b4;
          pfVar88 = &local_5fc.y;
          uVar99 = uVar96;
        }
        else {
          puVar103 = local_51c + 2;
          puVar102 = local_51c + 5;
          pfVar95 = local_504 + 2;
          pfVar100 = local_5b4 + 2;
          pfVar88 = &local_5f0;
          local_5c0[lVar93] = uVar98;
          uVar99 = uVar98;
        }
        if ((*pfVar88 == 0.0) && (!NAN(*pfVar88))) {
          pfVar88 = &local_5fc.y;
          if ((iVar108 != 0) && (pfVar88 = &local_5fc.z, iVar108 != 1)) {
            pfVar88 = &local_5f0;
          }
          *pfVar88 = 0.0;
        }
        pfVar88 = &local_5fc.y;
        if ((iVar108 != 0) && (pfVar88 = &local_5fc.z, iVar108 != 1)) {
          pfVar88 = &local_5f0;
        }
        if (0.0 <= *pfVar88) {
          fVar240 = (float)(int)(uVar99 + 1);
          if (iVar108 == 1) {
            *pfVar100 = fVar193 + (fVar240 / fVar210 - fVar225) / local_5fc.z;
            fVar240 = local_5fc.z * fVar210;
            puVar89 = local_4a8;
          }
          else if (iVar108 == 0) {
            *pfVar100 = fVar193 + (fVar240 / fVar226 - fVar196) / local_5fc.y;
            fVar240 = local_5fc.y * fVar226;
            puVar89 = local_3e8;
          }
          else {
            *pfVar100 = fVar193 + (fVar240 / fVar229 - fVar121) / local_5f0;
            fVar240 = local_5f0 * fVar229;
            puVar89 = (uint *)(puVar94 + 0x24);
          }
          *puVar102 = 1;
          *pfVar95 = 1.0 / fVar240;
          uVar99 = *puVar89;
        }
        else {
          fVar240 = (float)(int)uVar99;
          if (iVar108 == 1) {
            fVar240 = fVar240 / fVar210 - fVar225;
            puVar89 = local_4a8;
            fVar195 = local_5fc.z;
          }
          else if (iVar108 == 0) {
            fVar240 = fVar240 / fVar226 - fVar196;
            puVar89 = local_3e8;
            fVar195 = local_5fc.y;
          }
          else {
            fVar240 = fVar240 / fVar229 - fVar121;
            puVar89 = (uint *)(puVar94 + 0x24);
            fVar195 = local_5f0;
          }
          *pfVar100 = fVar193 + fVar240 / fVar195;
          uVar105 = *puVar89;
          uVar99 = 0xffffffff;
          *puVar102 = 0xffffffff;
          *pfVar95 = -1.0 / (fVar195 * (float)(int)uVar105);
        }
        lVar93 = lVar93 + 1;
        *puVar103 = uVar99;
      } while (lVar93 != 3);
      in_ZMM5 = ZEXT1664(local_5a8);
      auVar228 = ZEXT464((uint)local_538._0_4_);
      auVar247 = ZEXT464((uint)local_4f8._0_4_);
      aStack_318._60_4_ = (uint)((ulong)((long)puVar94 + 0x74) >> 0x20) | 0x10000;
      uVar84 = aStack_318._60_4_;
      auVar119 = _local_598;
      aStack_318._60_4_ = uVar1;
      while( true ) {
        auVar264 = ZEXT1664(auVar119);
        lVar93 = (long)*(int *)(&DAT_0056d940 +
                               (ulong)((uint)(local_5b4[1] < local_5b4[2]) |
                                      (uint)(local_5b4[0] < local_5b4[1]) * 4 +
                                      (uint)(local_5b4[0] < local_5b4[2]) * 2) * 4);
        fVar121 = local_5b4[lVar93];
        uVar1 = *(undefined4 *)
                 (puVar94[0x20] +
                 ((long)(int)((uVar85 * local_5c0[2] + local_5c0[1]) * (int)uVar87) +
                 (long)(int)local_5c0[0]) * 4);
        auVar13._4_4_ = uVar1;
        auVar13._0_4_ = uVar1;
        auVar13._8_4_ = uVar1;
        auVar13._12_4_ = uVar1;
        auVar111 = vmulps_avx512vl(auVar142._0_16_,auVar13);
        auVar113 = vminss_avx(ZEXT416((uint)fVar121),auVar247._0_16_);
        fVar196 = auVar111._0_4_;
        if ((fVar196 != 0.0) || (NAN(fVar196))) {
          _local_398 = auVar111;
          local_4b8._0_4_ = auVar113._0_4_;
          local_550 = (uint *)CONCAT44(local_550._4_4_,fVar121);
          uVar87 = uVar86;
          _local_5e8 = in_ZMM5._0_16_;
          local_488 = -fVar196;
          fStack_484 = -auVar111._4_4_;
          fStack_480 = -auVar111._8_4_;
          fStack_47c = -auVar111._12_4_;
          while( true ) {
            local_598._0_4_ = auVar264._0_4_;
            fVar121 = logf(1.0 - auVar228._0_4_);
            pSVar80 = local_548;
            auVar119 = ZEXT416((uint)local_4b8._0_4_);
            uVar86 = uVar87 * 0x5851f42d4c957f2d + (long)local_4d8;
            uVar85 = (uint)(uVar87 >> 0x2d) ^ (uint)(uVar87 >> 0x1b);
            bVar76 = (byte)(uVar87 >> 0x3b);
            fVar121 = (float)local_598._0_4_ - fVar121 / (float)local_398._0_4_;
            auVar264 = ZEXT464((uint)fVar121);
            auVar73._4_12_ = in_register_00001544;
            auVar73._0_4_ = in_XMM13_Da;
            auVar113 = vcvtusi2ss_avx512f(auVar73,uVar85 >> bVar76 | uVar85 << 0x20 - bVar76);
            auVar113 = vminss_avx(ZEXT416((uint)(auVar113._0_4_ * 2.3283064e-10)),
                                  ZEXT416(0x3f7fffff));
            auVar228 = ZEXT1664(auVar113);
            if ((float)local_4b8._0_4_ <= fVar121) break;
            uVar87 = uVar86;
            if (fVar121 < (float)local_4f8._0_4_) {
              fVar196 = fVar121 - (float)local_598._0_4_;
              auVar199._8_4_ = 0x3da00ac9;
              auVar199._0_8_ = 0x3da00ac93da00ac9;
              auVar199._12_4_ = 0x3da00ac9;
              auVar217._8_4_ = 0xffffff81;
              auVar217._0_8_ = 0xffffff81ffffff81;
              auVar217._12_4_ = 0xffffff81;
              local_538._0_4_ = auVar113._0_4_;
              _local_598 = ZEXT416((uint)fVar121);
              auVar129._0_4_ = fVar196 * local_488;
              auVar129._4_4_ = fVar196 * fStack_484;
              auVar129._8_4_ = fVar196 * fStack_480;
              auVar129._12_4_ = fVar196 * fStack_47c;
              auVar21._8_4_ = 0x3fb8aa3b;
              auVar21._0_8_ = 0x3fb8aa3b3fb8aa3b;
              auVar21._12_4_ = 0x3fb8aa3b;
              auVar113 = vmulps_avx512vl(auVar129,auVar21);
              auVar119 = vroundps_avx(auVar113,9);
              auVar113 = vsubps_avx(auVar113,auVar119);
              auVar22._8_4_ = 0x3e679a0b;
              auVar22._0_8_ = 0x3e679a0b3e679a0b;
              auVar22._12_4_ = 0x3e679a0b;
              auVar111 = vfmadd213ps_avx512vl(auVar199,auVar113,auVar22);
              auVar162._0_4_ = (int)auVar119._0_4_;
              auVar162._4_4_ = (int)auVar119._4_4_;
              auVar162._8_4_ = (int)auVar119._8_4_;
              auVar162._12_4_ = (int)auVar119._12_4_;
              auVar119 = vpaddd_avx(auVar162,auVar217);
              auVar23._8_4_ = 0x3f321004;
              auVar23._0_8_ = 0x3f3210043f321004;
              auVar23._12_4_ = 0x3f321004;
              auVar111 = vfmadd213ps_avx512vl(auVar111,auVar113,auVar23);
              auVar113 = vfmadd213ps_fma(auVar111,auVar113,local_5a8);
              auVar111 = vpsrld_avx(auVar113,0x17);
              auVar119 = vpaddd_avx(auVar119,auVar111);
              auVar24._8_4_ = 0x807fffff;
              auVar24._0_8_ = 0x807fffff807fffff;
              auVar24._12_4_ = 0x807fffff;
              auVar113 = vpandd_avx512vl(auVar113,auVar24);
              auVar25._8_4_ = 0x7f;
              auVar25._0_8_ = 0x7f0000007f;
              auVar25._12_4_ = 0x7f;
              uVar86 = vpcmpgtd_avx512vl(auVar119,auVar25);
              uVar86 = uVar86 & 0xf;
              uVar107 = vpcmpgtd_avx512vl(auVar119,auVar217);
              uVar107 = uVar107 & 0xf;
              auVar119 = vpslld_avx(auVar119,0x17);
              auVar26._8_4_ = 0x3f800000;
              auVar26._0_8_ = 0x3f8000003f800000;
              auVar26._12_4_ = 0x3f800000;
              auVar119 = vpaddd_avx512vl(auVar119,auVar26);
              auVar119 = vpord_avx512vl(auVar119,auVar113);
              auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
              bVar106 = (bool)((byte)uVar86 & 1);
              bVar12 = (bool)((byte)(uVar86 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar86 >> 2) & 1);
              bVar11 = SUB81(uVar86 >> 3,0);
              auVar163._0_4_ = fVar121 * (float)auStack_584._8_4_ + (float)local_588;
              auVar163._4_4_ = fVar121 * (float)auStack_584._12_4_ + (float)auStack_584._0_4_;
              auVar163._8_4_ = fVar121 * 0.0 + 0.0;
              auVar163._12_4_ = fVar121 * 0.0 + 0.0;
              auVar194 = ZEXT856(auVar163._8_8_);
              local_3b8._4_4_ =
                   (uint)bVar12 * auVar113._4_4_ |
                   (uint)!bVar12 * (uint)((byte)(uVar107 >> 1) & 1) * auVar119._4_4_;
              local_3b8._0_4_ =
                   (uint)bVar106 * auVar113._0_4_ |
                   (uint)!bVar106 * (uint)((byte)uVar107 & 1) * auVar119._0_4_;
              fStack_3b0 = (float)((uint)bVar10 * auVar113._8_4_ |
                                  (uint)!bVar10 * (uint)((byte)(uVar107 >> 2) & 1) * auVar119._8_4_)
              ;
              fStack_3ac = (float)((uint)bVar11 * auVar113._12_4_ |
                                  (uint)!bVar11 * (uint)(byte)(uVar107 >> 3) * auVar119._12_4_);
              local_5d0._0_8_ = vmovlps_avx(auVar163);
              local_5d0.z = fVar121 * (float)auStack_584._16_4_ + (float)auStack_584._4_4_;
              auVar157 = (undefined1  [56])0x0;
              SVar265 = UniformGridMediumProvider::Density
                                  ((UniformGridMediumProvider *)*puVar94,(Point3f *)&local_5d0,
                                   local_548);
              auVar183._0_8_ = SVar265.values.values._8_8_;
              auVar183._8_56_ = auVar194;
              auVar147._0_8_ = SVar265.values.values._0_8_;
              auVar147._8_56_ = auVar157;
              _local_478 = vmovlhps_avx(auVar147._0_16_,auVar183._0_16_);
              p.super_Tuple3<pbrt::Point3,_float>.z = local_5d0.z;
              p.super_Tuple3<pbrt::Point3,_float>.x = local_5d0.x;
              p.super_Tuple3<pbrt::Point3,_float>.y = local_5d0.y;
              auVar194 = SUB6456(ZEXT6064((undefined1  [60])0x0),4);
              auVar157 = ZEXT856(0);
              SVar265 = UniformGridMediumProvider::Le
                                  ((UniformGridMediumProvider *)*puVar94,p,pSVar80);
              auVar184._0_8_ = SVar265.values.values._8_8_;
              auVar184._8_56_ = auVar194;
              auVar148._0_8_ = SVar265.values.values._0_8_;
              auVar148._8_56_ = auVar157;
              aStack_318._64_4_ = (float)local_478._0_4_ * (float)local_498._0_4_;
              aStack_318._68_4_ = (float)local_478._4_4_ * (float)local_498._4_4_;
              aStack_318.ei.super_Interaction.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits._0_4_ = fStack_470 * fStack_490;
              aStack_318.ei.super_Interaction.medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits._4_4_ = fStack_46c * fStack_48c;
              aStack_318._80_4_ = (float)local_478._0_4_ * (float)local_3d8._0_4_;
              aStack_318._84_4_ = (float)local_478._4_4_ * (float)local_3d8._4_4_;
              aStack_318.mi.sigma_a.values.values[0] = fStack_470 * fStack_3d0;
              aStack_318.mi.sigma_a.values.values[1] = fStack_46c * fStack_3cc;
              aStack_318.mi.sigma_maj.values.values[2] =
                   (float)local_3b8._0_4_ * (float)local_5e8._0_4_;
              aStack_318.mi.sigma_maj.values.values[3] =
                   (float)local_3b8._4_4_ * (float)local_5e8._4_4_;
              aStack_318.mi.Le.values.values[0] = fStack_3b0 * fStack_5e0;
              aStack_318.mi.Le.values.values[1] = fStack_3ac * fStack_5dc;
              auVar119 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                       *(float *)((long)puVar94 + 0x7c))),
                                         ZEXT416((uint)local_5d0.x),
                                         ZEXT416(*(uint *)(puVar94 + 0xf)));
              auVar113 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                       *(float *)((long)puVar94 + 0xac))),
                                         ZEXT416((uint)local_5d0.x),
                                         ZEXT416(*(uint *)(puVar94 + 0x15)));
              auVar111 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                       *(float *)((long)puVar94 + 0x8c))),
                                         ZEXT416((uint)local_5d0.x),
                                         ZEXT416(*(uint *)(puVar94 + 0x11)));
              auVar114 = vfmadd231ss_fma(ZEXT416((uint)(local_5d0.y *
                                                       *(float *)((long)puVar94 + 0x9c))),
                                         ZEXT416((uint)local_5d0.x),
                                         ZEXT416(*(uint *)(puVar94 + 0x13)));
              auVar119 = vfmadd231ss_fma(auVar119,ZEXT416((uint)local_5d0.z),
                                         ZEXT416(*(uint *)(puVar94 + 0x10)));
              auVar113 = vfmadd231ss_fma(auVar113,ZEXT416((uint)local_5d0.z),
                                         ZEXT416(*(uint *)(puVar94 + 0x16)));
              auVar111 = vfmadd231ss_fma(auVar111,ZEXT416((uint)local_5d0.z),
                                         ZEXT416(*(uint *)(puVar94 + 0x12)));
              auVar114 = vfmadd231ss_fma(auVar114,ZEXT416((uint)local_5d0.z),
                                         ZEXT416(*(uint *)(puVar94 + 0x14)));
              fVar121 = auVar113._0_4_ + *(float *)((long)puVar94 + 0xb4);
              fVar196 = auVar119._0_4_ + *(float *)((long)puVar94 + 0x84);
              fVar225 = auVar111._0_4_ + *(float *)((long)puVar94 + 0x94);
              fVar210 = auVar114._0_4_ + *(float *)((long)puVar94 + 0xa4);
              bVar106 = fVar121 == 1.0;
              iVar108 = (uint)bVar106 * (int)fVar196 + (uint)!bVar106 * (int)(fVar196 / fVar121);
              iVar109 = (uint)bVar106 * (int)fVar210 + (uint)!bVar106 * (int)(fVar210 / fVar121);
              iVar110 = (uint)bVar106 * (int)fVar225 + (uint)!bVar106 * (int)(fVar225 / fVar121);
              auVar242._4_4_ = iVar108;
              auVar242._0_4_ = iVar108;
              auVar242._8_4_ = iVar108;
              auVar242._12_4_ = iVar108;
              auVar249._4_4_ = iVar110;
              auVar249._0_4_ = iVar110;
              auVar249._8_4_ = iVar110;
              auVar249._12_4_ = iVar110;
              auVar232._4_4_ = iVar109;
              auVar232._0_4_ = iVar109;
              auVar232._8_4_ = iVar109;
              auVar232._12_4_ = iVar109;
              auVar113 = vmovlhps_avx(auVar242,auVar249);
              aStack_318._16_16_ = ZEXT416(0) << 0x20;
              auVar257._0_4_ = local_410._12_4_ * local_410._12_4_;
              auVar257._4_4_ = local_410._16_4_ * local_410._16_4_;
              auVar257._8_8_ = 0;
              auVar254._0_8_ = local_410._12_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = 0x80000000;
              auVar254._12_4_ = 0x80000000;
              auVar119 = vhaddps_avx(auVar257,auVar257);
              auVar119 = ZEXT416((uint)(auVar119._0_4_ + fStack_3fc * fStack_3fc));
              auVar119 = vsqrtss_avx(auVar119,auVar119);
              aStack_318._112_16_ = vmovlhps_avx(auVar148._0_16_,auVar184._0_16_);
              fVar121 = auVar119._0_4_;
              auVar262._4_4_ = fVar121;
              auVar262._0_4_ = fVar121;
              auVar262._8_4_ = fVar121;
              auVar262._12_4_ = fVar121;
              aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = -fStack_3fc / fVar121;
              auVar119 = vdivps_avx(auVar254,auVar262);
              aStack_318.mi.sigma_a.values.values[2] = local_398._0_4_;
              aStack_318.mi.sigma_a.values.values[3] = local_398._4_4_;
              aStack_318.mi.sigma_s.values.values[0] = local_398._8_4_;
              aStack_318.mi.sigma_s.values.values[1] = local_398._12_4_;
              aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
              local_330._0_4_ = auVar113._0_4_;
              local_330._4_4_ = auVar113._4_4_;
              local_330._8_4_ = auVar113._8_4_;
              local_330._12_4_ = auVar113._12_4_;
              uVar4 = vmovlps_avx(auVar232);
              local_330._16_4_ = (undefined4)uVar4;
              local_330._20_4_ = (undefined4)((ulong)uVar4 >> 0x20);
              aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = FStack_3f8;
              uVar4 = vmovlps_avx(auVar119);
              aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar4;
              aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
              super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)((ulong)uVar4 >> 0x20);
              aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
              aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
              aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
                   (float)((long)puVar94 + 0x74);
              aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
                   (float)uVar211;
              aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar2;
              aStack_318._60_4_ = uVar84;
              bVar106 = RandomWalk::anon_class_88_11_14aa307c::operator()
                                  (&local_468,(MediumSample *)local_330);
              if (!bVar106) goto LAB_003f3fac;
              auVar228 = ZEXT464((uint)local_538._0_4_);
              auVar264 = ZEXT1664(_local_598);
              _local_5e8 = local_5a8;
            }
          }
          fVar121 = (float)local_4b8._0_4_ - (float)local_598._0_4_;
          auVar247 = ZEXT464((uint)local_4f8._0_4_);
          auVar142 = ZEXT1664(local_3c8);
          auVar128._0_4_ = fVar121 * local_488;
          auVar128._4_4_ = fVar121 * fStack_484;
          auVar128._8_4_ = fVar121 * fStack_480;
          auVar128._12_4_ = fVar121 * fStack_47c;
          fVar121 = local_550._0_4_;
          auVar113 = _local_5e8;
        }
        else {
          fVar225 = auVar113._0_4_ - auVar119._0_4_;
          auVar128._0_4_ = fVar225 * -fVar196;
          auVar128._4_4_ = fVar225 * -auVar111._4_4_;
          auVar128._8_4_ = fVar225 * -auVar111._8_4_;
          auVar128._12_4_ = fVar225 * -auVar111._12_4_;
          auVar119 = auVar113;
          auVar113 = in_ZMM5._0_16_;
        }
        auVar216._8_4_ = 0xffffff81;
        auVar216._0_8_ = 0xffffff81ffffff81;
        auVar198._8_4_ = 0x3da00ac9;
        auVar198._0_8_ = 0x3da00ac93da00ac9;
        auVar216._12_4_ = 0xffffff81;
        auVar198._12_4_ = 0x3da00ac9;
        auVar14._8_4_ = 0x3fb8aa3b;
        auVar14._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar14._12_4_ = 0x3fb8aa3b;
        auVar114 = vmulps_avx512vl(auVar128,auVar14);
        auVar111 = vroundps_avx(auVar114,9);
        auVar114 = vsubps_avx(auVar114,auVar111);
        auVar15._8_4_ = 0x3e679a0b;
        auVar15._0_8_ = 0x3e679a0b3e679a0b;
        auVar15._12_4_ = 0x3e679a0b;
        auVar115 = vfmadd213ps_avx512vl(auVar198,auVar114,auVar15);
        auVar164._0_4_ = (int)auVar111._0_4_;
        auVar164._4_4_ = (int)auVar111._4_4_;
        auVar164._8_4_ = (int)auVar111._8_4_;
        auVar164._12_4_ = (int)auVar111._12_4_;
        auVar111 = vpaddd_avx(auVar164,auVar216);
        auVar16._8_4_ = 0x3f321004;
        auVar16._0_8_ = 0x3f3210043f321004;
        auVar16._12_4_ = 0x3f321004;
        auVar115 = vfmadd213ps_avx512vl(auVar115,auVar114,auVar16);
        auVar114 = vfmadd213ps_fma(auVar115,auVar114,local_5a8);
        auVar115 = vpsrld_avx(auVar114,0x17);
        auVar111 = vpaddd_avx(auVar111,auVar115);
        auVar17._8_4_ = 0x7f;
        auVar17._0_8_ = 0x7f0000007f;
        auVar17._12_4_ = 0x7f;
        uVar87 = vpcmpgtd_avx512vl(auVar111,auVar17);
        uVar87 = uVar87 & 0xf;
        auVar18._8_4_ = 0x807fffff;
        auVar18._0_8_ = 0x807fffff807fffff;
        auVar18._12_4_ = 0x807fffff;
        auVar114 = vpandd_avx512vl(auVar114,auVar18);
        uVar107 = vpcmpgtd_avx512vl(auVar111,auVar216);
        uVar107 = uVar107 & 0xf;
        auVar111 = vpslld_avx(auVar111,0x17);
        auVar19._8_4_ = 0x3f800000;
        auVar19._0_8_ = 0x3f8000003f800000;
        auVar19._12_4_ = 0x3f800000;
        auVar111 = vpaddd_avx512vl(auVar111,auVar19);
        auVar111 = vpord_avx512vl(auVar111,auVar114);
        auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        bVar106 = (bool)((byte)uVar87 & 1);
        bVar12 = (bool)((byte)(uVar87 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar87 >> 2) & 1);
        bVar11 = SUB81(uVar87 >> 3,0);
        in_ZMM5 = ZEXT1664(CONCAT412((float)((uint)bVar11 * auVar114._12_4_ |
                                            (uint)!bVar11 *
                                            (uint)(byte)(uVar107 >> 3) * auVar111._12_4_) *
                                     auVar113._12_4_,
                                     CONCAT48((float)((uint)bVar10 * auVar114._8_4_ |
                                                     (uint)!bVar10 *
                                                     (uint)((byte)(uVar107 >> 2) & 1) *
                                                     auVar111._8_4_) * auVar113._8_4_,
                                              CONCAT44((float)((uint)bVar12 * auVar114._4_4_ |
                                                              (uint)!bVar12 *
                                                              (uint)((byte)(uVar107 >> 1) & 1) *
                                                              auVar111._4_4_) * auVar113._4_4_,
                                                       (float)((uint)bVar106 * auVar114._0_4_ |
                                                              (uint)!bVar106 *
                                                              (uint)((byte)uVar107 & 1) *
                                                              auVar111._0_4_) * auVar113._0_4_))));
        if ((auVar247._0_4_ < fVar121) ||
           (uVar85 = local_5c0[lVar93], uVar92 = local_51c[lVar93 + 3],
           local_5c0[lVar93] = uVar85 + uVar92, puVar102 = local_3e8, puVar103 = local_4a8,
           uVar85 + uVar92 == local_51c[lVar93])) break;
        local_5b4[lVar93] = fVar121 + local_504[lVar93];
        uVar87 = (ulong)*puVar102;
        uVar85 = *puVar103;
      }
      goto LAB_003f3fbb;
    }
    local_468.terminated = &local_5fd;
    local_468.beta = &local_4c8;
    auVar124._0_4_ = (float)(undefined4)uVar87 * (float)(undefined4)uVar87;
    auVar124._4_4_ = (float)uVar87._4_4_ * (float)uVar87._4_4_;
    auVar124._8_8_ = 0;
    fVar196 = (float)uVar107;
    auVar194 = (undefined1  [56])0x0;
    local_4f8._0_4_ = fVar121;
    this_01 = (DenselySampledSpectrum *)(TVar8.bits & 0xffffffffffff);
    auVar115 = vhaddps_avx(auVar124,auVar124);
    local_468.sampler = local_528;
    local_468.pdfFwd = &local_5d4;
    local_468.vertex = local_540;
    local_468.bounces = &local_5ec;
    local_598._0_4_ = fVar196 * fVar196 + auVar115._0_4_;
    local_468.prev = local_4e0;
    local_468.maxDepth = &maxDepth;
    local_468.anyNonSpecularBounces = &local_5fe;
    local_468.ray = local_558;
    local_468.scattered = &local_5ff;
    iVar108 = this_01[3].lambda_min;
    local_4d8._4_4_ = iVar108;
    local_4d8._0_4_ = iVar108;
    fStack_4d0 = (float)iVar108;
    fStack_4cc = (float)iVar108;
    auVar157 = ZEXT856(local_4d8._8_8_);
    local_4b8 = auVar119;
    _local_478 = auVar111;
    _local_3b8 = auVar113;
    SVar265 = DenselySampledSpectrum::Sample(this_01,local_548);
    auVar179._0_8_ = SVar265.values.values._8_8_;
    auVar179._8_56_ = auVar194;
    auVar143._0_8_ = SVar265.values.values._0_8_;
    auVar143._8_56_ = auVar157;
    auVar119 = vmovlhps_avx(auVar143._0_16_,auVar179._0_16_);
    local_4d8._4_4_ = auVar119._4_4_ * (float)local_4d8._4_4_;
    local_4d8._0_4_ = auVar119._0_4_ * (float)local_4d8._0_4_;
    fStack_4d0 = auVar119._8_4_ * fStack_4d0;
    fStack_4cc = auVar119._12_4_ * fStack_4cc;
    _local_598 = vsqrtss_avx(auVar114,ZEXT416((uint)local_598._0_4_));
    iVar108 = this_01[3].lambda_min;
    auVar125._4_4_ = iVar108;
    auVar125._0_4_ = iVar108;
    auVar125._8_4_ = iVar108;
    auVar125._12_4_ = iVar108;
    auVar157 = ZEXT856(auVar125._8_8_);
    _local_398 = auVar125;
    SVar265 = DenselySampledSpectrum::Sample(this_01 + 1,pSVar80);
    pVVar104 = path;
    auVar180._0_8_ = SVar265.values.values._8_8_;
    auVar180._8_56_ = auVar194;
    auVar144._0_8_ = SVar265.values.values._0_8_;
    auVar144._8_56_ = auVar157;
    auVar119 = vmovlhps_avx(auVar144._0_16_,auVar180._0_16_);
    fVar196 = auVar119._0_4_ * (float)local_398._0_4_;
    fVar225 = auVar119._4_4_ * (float)local_398._4_4_;
    fVar210 = auVar119._8_4_ * fStack_390;
    fVar226 = auVar119._12_4_ * fStack_38c;
    fVar229 = fVar196 + (float)local_4d8._0_4_;
    fVar193 = fVar225 + (float)local_4d8._4_4_;
    fVar240 = fVar210 + fStack_4d0;
    fVar195 = fVar226 + fStack_4cc;
    bVar106 = ABS((float)local_598._0_4_ * (float)local_5e8._0_4_) == INFINITY;
    fVar121 = (float)((uint)bVar106 * 0x7f7fffff +
                     (uint)!bVar106 * (int)((float)local_598._0_4_ * (float)local_5e8._0_4_));
    if ((fVar229 != 0.0) || (NAN(fVar229))) {
      _local_398 = ZEXT1632(CONCAT412(fVar195,CONCAT48(fVar240,CONCAT44(fVar193,fVar229))));
      _local_5e8 = ZEXT416((uint)fVar121);
      local_488 = fVar196;
      fStack_484 = fVar225;
      fStack_480 = fVar210;
      fStack_47c = fVar226;
      fVar121 = logf(1.0 - (float)local_538._0_4_);
      fVar196 = local_398._0_4_;
      fVar121 = -fVar121 / fVar196;
      if ((float)local_5e8._0_4_ <= fVar121) {
        auVar207._8_4_ = 0x3da00ac9;
        auVar207._0_8_ = 0x3da00ac93da00ac9;
        auVar207._12_4_ = 0x3da00ac9;
        auVar224._8_4_ = 0xffffff81;
        auVar224._0_8_ = 0xffffff81ffffff81;
        auVar224._12_4_ = 0xffffff81;
        local_88._0_4_ = fVar196 * -(float)local_5e8._0_4_;
        local_88._4_4_ = local_398._4_4_ * -(float)local_5e8._0_4_;
        local_88._8_4_ = local_398._8_4_ * -(float)local_5e8._0_4_;
        local_88._12_4_ = local_398._12_4_ * -(float)local_5e8._0_4_;
        auVar41._8_4_ = 0x3fb8aa3b;
        auVar41._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar41._12_4_ = 0x3fb8aa3b;
        auVar113 = vmulps_avx512vl(local_88,auVar41);
        auVar119 = vroundps_avx(auVar113,9);
        auVar113 = vsubps_avx(auVar113,auVar119);
        auVar42._8_4_ = 0x3e679a0b;
        auVar42._0_8_ = 0x3e679a0b3e679a0b;
        auVar42._12_4_ = 0x3e679a0b;
        auVar111 = vfmadd213ps_avx512vl(auVar207,auVar113,auVar42);
        auVar177._0_4_ = (int)auVar119._0_4_;
        auVar177._4_4_ = (int)auVar119._4_4_;
        auVar177._8_4_ = (int)auVar119._8_4_;
        auVar177._12_4_ = (int)auVar119._12_4_;
        auVar119 = vpaddd_avx(auVar177,auVar224);
        auVar43._8_4_ = 0x3f321004;
        auVar43._0_8_ = 0x3f3210043f321004;
        auVar43._12_4_ = 0x3f321004;
        auVar111 = vfmadd213ps_avx512vl(auVar111,auVar113,auVar43);
        auVar113 = vfmadd213ps_fma(auVar111,auVar113,local_5a8);
        auVar111 = vpsrld_avx(auVar113,0x17);
        auVar119 = vpaddd_avx(auVar119,auVar111);
        auVar44._8_4_ = 0x7f;
        auVar44._0_8_ = 0x7f0000007f;
        auVar44._12_4_ = 0x7f;
        uVar86 = vpcmpgtd_avx512vl(auVar119,auVar44);
        uVar86 = uVar86 & 0xf;
        auVar45._8_4_ = 0x807fffff;
        auVar45._0_8_ = 0x807fffff807fffff;
        auVar45._12_4_ = 0x807fffff;
        auVar113 = vpandd_avx512vl(auVar113,auVar45);
        uVar87 = vpcmpgtd_avx512vl(auVar119,auVar224);
        uVar87 = uVar87 & 0xf;
        auVar119 = vpslld_avx(auVar119,0x17);
        auVar46._8_4_ = 0x3f800000;
        auVar46._0_8_ = 0x3f8000003f800000;
        auVar46._12_4_ = 0x3f800000;
        auVar119 = vpaddd_avx512vl(auVar119,auVar46);
        auVar119 = vpord_avx512vl(auVar119,auVar113);
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        bVar106 = (bool)((byte)uVar86 & 1);
        auVar118._0_4_ =
             (uint)bVar106 * auVar113._0_4_ |
             (uint)!bVar106 * (uint)((byte)uVar87 & 1) * auVar119._0_4_;
        bVar106 = (bool)((byte)(uVar86 >> 1) & 1);
        auVar118._4_4_ =
             (uint)bVar106 * auVar113._4_4_ |
             (uint)!bVar106 * (uint)((byte)(uVar87 >> 1) & 1) * auVar119._4_4_;
        bVar106 = (bool)((byte)(uVar86 >> 2) & 1);
        auVar118._8_4_ =
             (uint)bVar106 * auVar113._8_4_ |
             (uint)!bVar106 * (uint)((byte)(uVar87 >> 2) & 1) * auVar119._8_4_;
        bVar106 = SUB81(uVar86 >> 3,0);
        auVar118._12_4_ =
             (uint)bVar106 * auVar113._12_4_ |
             (uint)!bVar106 * (uint)(byte)(uVar87 >> 3) * auVar119._12_4_;
        auVar119 = vshufpd_avx(auVar118,auVar118,1);
        local_a8 = auVar118;
      }
      else {
        _local_5e8 = vpermilpd_avx(_local_4d8,1);
        local_498 = (undefined1  [8])(CONCAT44(extraout_var._0_4_,fVar121) ^ 0x8000000000000000);
        fStack_490 = (float)(extraout_var._4_4_ ^ 0x80000000);
        fStack_48c = (float)(extraout_var._8_4_ ^ 0x80000000);
        auVar138._4_4_ = local_598._0_4_;
        auVar138._0_4_ = local_598._0_4_;
        auVar138._8_4_ = local_598._0_4_;
        auVar138._12_4_ = local_598._0_4_;
        _local_478 = vdivps_avx(_local_478,auVar138);
        auVar206._8_4_ = 0x3da00ac9;
        auVar206._0_8_ = 0x3da00ac93da00ac9;
        auVar206._12_4_ = 0x3da00ac9;
        auVar223._8_4_ = 0xffffff81;
        auVar223._0_8_ = 0xffffff81ffffff81;
        auVar223._12_4_ = 0xffffff81;
        local_98._0_4_ = fVar196 * -fVar121;
        local_98._4_4_ = local_398._4_4_ * -fVar121;
        local_98._8_4_ = local_398._8_4_ * -fVar121;
        local_98._12_4_ = local_398._12_4_ * -fVar121;
        auVar33._8_4_ = 0x3fb8aa3b;
        auVar33._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar33._12_4_ = 0x3fb8aa3b;
        auVar113 = vmulps_avx512vl(local_98,auVar33);
        auVar119 = vroundps_avx(auVar113,9);
        auVar113 = vsubps_avx(auVar113,auVar119);
        auVar34._8_4_ = 0x3e679a0b;
        auVar34._0_8_ = 0x3e679a0b3e679a0b;
        auVar34._12_4_ = 0x3e679a0b;
        auVar111 = vfmadd213ps_avx512vl(auVar206,auVar113,auVar34);
        auVar174._0_4_ = (int)auVar119._0_4_;
        auVar174._4_4_ = (int)auVar119._4_4_;
        auVar174._8_4_ = (int)auVar119._8_4_;
        auVar174._12_4_ = (int)auVar119._12_4_;
        auVar119 = vpaddd_avx(auVar174,auVar223);
        auVar35._8_4_ = 0x3f321004;
        auVar35._0_8_ = 0x3f3210043f321004;
        auVar35._12_4_ = 0x3f321004;
        auVar111 = vfmadd213ps_avx512vl(auVar111,auVar113,auVar35);
        auVar113 = vfmadd213ps_fma(auVar111,auVar113,local_5a8);
        auVar111 = vpsrld_avx(auVar113,0x17);
        auVar119 = vpaddd_avx(auVar119,auVar111);
        auVar36._8_4_ = 0x7f;
        auVar36._0_8_ = 0x7f0000007f;
        auVar36._12_4_ = 0x7f;
        uVar86 = vpcmpgtd_avx512vl(auVar119,auVar36);
        uVar86 = uVar86 & 0xf;
        auVar37._8_4_ = 0x807fffff;
        auVar37._0_8_ = 0x807fffff807fffff;
        auVar37._12_4_ = 0x807fffff;
        auVar113 = vpandd_avx512vl(auVar113,auVar37);
        uVar87 = vpcmpgtd_avx512vl(auVar119,auVar223);
        uVar87 = uVar87 & 0xf;
        auVar119 = vpslld_avx(auVar119,0x17);
        auVar38._8_4_ = 0x3f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._12_4_ = 0x3f800000;
        auVar119 = vpaddd_avx512vl(auVar119,auVar38);
        auVar119 = vpord_avx512vl(auVar119,auVar113);
        auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        bVar106 = (bool)((byte)uVar86 & 1);
        local_1d8 = (float)((uint)bVar106 * auVar111._0_4_ |
                           (uint)!bVar106 * (uint)((byte)uVar87 & 1) * auVar119._0_4_);
        bVar106 = (bool)((byte)(uVar86 >> 1) & 1);
        fStack_1d4 = (float)((uint)bVar106 * auVar111._4_4_ |
                            (uint)!bVar106 * (uint)((byte)(uVar87 >> 1) & 1) * auVar119._4_4_);
        bVar106 = (bool)((byte)(uVar86 >> 2) & 1);
        fStack_1d0 = (float)((uint)bVar106 * auVar111._8_4_ |
                            (uint)!bVar106 * (uint)((byte)(uVar87 >> 2) & 1) * auVar119._8_4_);
        bVar106 = SUB81(uVar86 >> 3,0);
        fStack_1cc = (float)((uint)bVar106 * auVar111._12_4_ |
                            (uint)!bVar106 * (uint)(byte)(uVar87 >> 3) * auVar119._12_4_);
        local_598._4_4_ = local_4b8._4_4_;
        local_598._0_4_ = (float)local_4b8._0_4_ / (float)local_598._0_4_;
        fStack_590 = (float)local_4b8._8_4_;
        fStack_58c = (float)local_4b8._12_4_;
        local_538 = vshufpd_avx(local_398._0_16_,local_398._0_16_,1);
        iVar108 = this_01[3].lambda_max;
        local_3d8._4_4_ = iVar108;
        local_3d8._0_4_ = iVar108;
        fStack_3d0 = (float)iVar108;
        fStack_3cc = (float)iVar108;
        auVar157 = ZEXT856(local_3d8._8_8_);
        auVar194 = ZEXT856(auVar113._8_8_);
        SVar265 = DenselySampledSpectrum::Sample(this_01 + 2,local_548);
        auVar192._0_8_ = SVar265.values.values._8_8_;
        auVar192._8_56_ = auVar194;
        auVar154._0_8_ = SVar265.values.values._0_8_;
        auVar154._8_56_ = auVar157;
        auVar119 = vpunpcklqdq_avx(auVar154._0_16_,auVar192._0_16_);
        auVar239._0_4_ = auVar119._0_4_ * (float)local_3d8._0_4_;
        auVar239._4_4_ = auVar119._4_4_ * (float)local_3d8._4_4_;
        auVar239._8_4_ = auVar119._8_4_ * fStack_3d0;
        auVar239._12_4_ = auVar119._12_4_ * fStack_3cc;
        aStack_318._84_4_ = fStack_484;
        aStack_318._80_4_ = local_488;
        aStack_318._48_8_ = &this_01[0x66666666666].values.ptr;
        aStack_318._60_4_ = (uint)((ulong)&this_01[3].values >> 0x20) | 0x10000;
        auVar119 = vmovshdup_avx(_local_478);
        fVar121 = local_598._0_4_ * (float)local_498._0_4_ + (float)local_4f8._0_4_;
        aStack_318.mi.sigma_a.values.values[0] = fStack_480;
        aStack_318.mi.sigma_a.values.values[1] = fStack_47c;
        aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        auVar39._8_4_ = 0x80000000;
        auVar39._0_8_ = 0x8000000080000000;
        auVar39._12_4_ = 0x80000000;
        auVar111 = vxorps_avx512vl(_local_478,auVar39);
        auVar40._8_4_ = 0x80000000;
        auVar40._0_8_ = 0x8000000080000000;
        auVar40._12_4_ = 0x80000000;
        auVar114 = vxorps_avx512vl(_local_598,auVar40);
        local_58 = ZEXT1632(auVar239);
        fVar196 = local_3b8._0_4_ + local_478._0_4_ * (float)local_498._0_4_;
        auVar113 = vmovshdup_avx(_local_3b8);
        fVar225 = auVar113._0_4_ + auVar119._0_4_ * (float)local_498._0_4_;
        auVar139._4_4_ = fVar196;
        auVar139._0_4_ = fVar196;
        auVar139._8_4_ = fVar196;
        auVar139._12_4_ = fVar196;
        auVar175._4_4_ = fVar225;
        auVar175._0_4_ = fVar225;
        auVar175._8_4_ = fVar225;
        auVar175._12_4_ = fVar225;
        auVar119 = vmovlhps_avx(auVar139,auVar175);
        auVar176._4_4_ = fVar121;
        auVar176._0_4_ = fVar121;
        auVar176._8_4_ = fVar121;
        auVar176._12_4_ = fVar121;
        aStack_318._16_12_ = ZEXT812(0);
        aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_330._0_4_ = auVar119._0_4_;
        local_330._4_4_ = auVar119._4_4_;
        local_330._8_4_ = auVar119._8_4_;
        local_330._12_4_ = auVar119._12_4_;
        uVar4 = vmovlps_avx(auVar176);
        local_330._16_4_ = (undefined4)uVar4;
        local_330._20_4_ = (undefined4)((ulong)uVar4 >> 0x20);
        aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = (Float)vextractps_avx(local_4b8,1);
        uVar4 = vmovlps_avx(auVar111);
        aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = (Float)uVar4;
        aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = (Float)((ulong)uVar4 >> 0x20);
        aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = (Float)auVar114._0_4_;
        aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
        aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
        aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
             SUB84(&this_01[3].values,0);
        auVar119 = vunpcklpd_avx(_local_4d8,_local_5e8);
        aStack_318._64_4_ = auVar119._0_4_;
        aStack_318._68_4_ = auVar119._4_4_;
        aStack_318.ei.super_Interaction.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits._0_4_ = auVar119._8_4_;
        aStack_318.ei.super_Interaction.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits._4_4_ = auVar119._12_4_;
        auVar141._0_16_ = local_398._0_16_;
        auVar141._16_16_ = auVar239;
        auVar178._16_16_ = local_538;
        auVar178._0_16_ = auVar141._0_16_;
        auVar178 = vperm2f128_avx(auVar178,local_58,0x21);
        auVar178 = vshufpd_avx(auVar141,auVar178,8);
        aStack_318.mi.sigma_a.values.values[2] = auVar178._0_4_;
        aStack_318.mi.sigma_a.values.values[3] = auVar178._4_4_;
        aStack_318.mi.sigma_s.values.values[0] = auVar178._8_4_;
        aStack_318.mi.sigma_s.values.values[1] = auVar178._12_4_;
        aStack_318._112_16_ = auVar178._16_16_;
        aStack_318.mi.sigma_maj.values.values[2] = local_1d8;
        aStack_318.mi.sigma_maj.values.values[3] = fStack_1d4;
        aStack_318.mi.Le.values.values[0] = fStack_1d0;
        aStack_318.mi.Le.values.values[1] = fStack_1cc;
        RandomWalk::anon_class_88_11_14aa307c::operator()(&local_468,(MediumSample *)local_330);
        auVar119 = local_5a8;
        auVar118 = local_5a8;
      }
      in_ZMM5 = ZEXT1664(auVar118);
    }
    else {
      auVar197._8_4_ = 0x3da00ac9;
      auVar197._0_8_ = 0x3da00ac93da00ac9;
      auVar197._12_4_ = 0x3da00ac9;
      auVar214._8_4_ = 0xffffff81;
      auVar214._0_8_ = 0xffffff81ffffff81;
      auVar214._12_4_ = 0xffffff81;
      local_68._0_4_ = fVar229 * -fVar121;
      local_68._4_4_ = fVar193 * -fVar121;
      local_68._8_4_ = fVar240 * -fVar121;
      local_68._12_4_ = fVar195 * -fVar121;
      auVar27._8_4_ = 0x3fb8aa3b;
      auVar27._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar27._12_4_ = 0x3fb8aa3b;
      auVar113 = vmulps_avx512vl(local_68,auVar27);
      auVar119 = vroundps_avx(auVar113,9);
      auVar113 = vsubps_avx(auVar113,auVar119);
      auVar28._8_4_ = 0x3e679a0b;
      auVar28._0_8_ = 0x3e679a0b3e679a0b;
      auVar28._12_4_ = 0x3e679a0b;
      auVar111 = vfmadd213ps_avx512vl(auVar197,auVar113,auVar28);
      auVar160._0_4_ = (int)auVar119._0_4_;
      auVar160._4_4_ = (int)auVar119._4_4_;
      auVar160._8_4_ = (int)auVar119._8_4_;
      auVar160._12_4_ = (int)auVar119._12_4_;
      auVar119 = vpaddd_avx(auVar160,auVar214);
      auVar29._8_4_ = 0x3f321004;
      auVar29._0_8_ = 0x3f3210043f321004;
      auVar29._12_4_ = 0x3f321004;
      auVar111 = vfmadd213ps_avx512vl(auVar111,auVar113,auVar29);
      auVar113 = vfmadd213ps_fma(auVar111,auVar113,local_5a8);
      auVar111 = vpsrld_avx(auVar113,0x17);
      auVar119 = vpaddd_avx(auVar119,auVar111);
      auVar30._8_4_ = 0x7f;
      auVar30._0_8_ = 0x7f0000007f;
      auVar30._12_4_ = 0x7f;
      uVar86 = vpcmpgtd_avx512vl(auVar119,auVar30);
      uVar86 = uVar86 & 0xf;
      auVar31._8_4_ = 0x807fffff;
      auVar31._0_8_ = 0x807fffff807fffff;
      auVar31._12_4_ = 0x807fffff;
      auVar113 = vpandd_avx512vl(auVar113,auVar31);
      uVar87 = vpcmpgtd_avx512vl(auVar119,auVar214);
      uVar87 = uVar87 & 0xf;
      auVar119 = vpslld_avx(auVar119,0x17);
      auVar32._8_4_ = 0x3f800000;
      auVar32._0_8_ = 0x3f8000003f800000;
      auVar32._12_4_ = 0x3f800000;
      auVar119 = vpaddd_avx512vl(auVar119,auVar32);
      auVar119 = vpord_avx512vl(auVar119,auVar113);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      bVar106 = (bool)((byte)uVar86 & 1);
      local_78._0_4_ =
           (uint)bVar106 * auVar113._0_4_ |
           (uint)!bVar106 * (uint)((byte)uVar87 & 1) * auVar119._0_4_;
      bVar106 = (bool)((byte)(uVar86 >> 1) & 1);
      local_78._4_4_ =
           (uint)bVar106 * auVar113._4_4_ |
           (uint)!bVar106 * (uint)((byte)(uVar87 >> 1) & 1) * auVar119._4_4_;
      bVar106 = (bool)((byte)(uVar86 >> 2) & 1);
      local_78._8_4_ =
           (uint)bVar106 * auVar113._8_4_ |
           (uint)!bVar106 * (uint)((byte)(uVar87 >> 2) & 1) * auVar119._8_4_;
      bVar106 = SUB81(uVar86 >> 3,0);
      local_78._12_4_ =
           (uint)bVar106 * auVar113._12_4_ |
           (uint)!bVar106 * (uint)(byte)(uVar87 >> 3) * auVar119._12_4_;
      auVar119 = vshufpd_avx(local_78,local_78,1);
      in_ZMM5 = ZEXT1664(local_78);
    }
    goto LAB_003f3fde;
  }
  goto LAB_003f400c;
LAB_003f3fac:
  in_ZMM5 = ZEXT1664(local_5a8);
LAB_003f3fbb:
  auVar119 = vshufpd_avx(in_ZMM5._0_16_,in_ZMM5._0_16_,1);
  pVVar104 = path;
LAB_003f3fde:
  this_02 = local_348;
  ray = local_558;
  if (local_5ff == false) {
    uVar211 = in_ZMM5._0_4_;
    auVar172._4_4_ = uVar211;
    auVar172._0_4_ = uVar211;
    auVar172._8_4_ = uVar211;
    auVar172._12_4_ = uVar211;
    auVar119 = vmovlhps_avx(in_ZMM5._0_16_,auVar119);
    auVar119 = vdivps_avx(auVar119,auVar172);
    local_4c8.values.values[1] = auVar119._4_4_ * local_4c8.values.values[1];
    local_4c8.values.values[0] = auVar119._0_4_ * local_4c8.values.values[0];
    local_4c8.values.values[2] = auVar119._8_4_ * local_4c8.values.values[2];
    local_4c8.values.values[3] = auVar119._12_4_ * local_4c8.values.values[3];
  }
LAB_003f400c:
  auVar142 = ZEXT1664(local_5a8);
  if (local_5fd == true) {
    iVar108 = 1;
    local_39c = local_5ec;
    goto LAB_003f4ada;
  }
  iVar108 = 2;
  if (local_5ff != false) goto LAB_003f4ada;
  if ((byte)local_b8 == '\0') {
    iVar108 = 3;
    if (mode == Radiance) {
      uVar86._0_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar86._4_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar204._8_8_ = 0;
      auVar204._0_8_ = uVar86;
      fVar121 = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z;
      FVar120 = (ray->super_Ray).time;
      in_ZMM5 = ZEXT464((uint)FVar120);
      uVar9 = (ray->super_Ray).medium.
              super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
              .bits;
      fVar196 = fVar121 + (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
      fVar225 = (float)(undefined4)uVar86 + (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x;
      auVar119 = vmovshdup_avx(auVar204);
      fVar210 = auVar119._0_4_ + (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
      aStack_318.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      aStack_318.mi.Le.values.values[0] = 0.0;
      aStack_318.mi.Le.values.values[1] = 0.0;
      aStack_318._144_8_ = 0;
      auVar205._0_8_ = uVar86 ^ 0x8000000080000000;
      auVar205._8_4_ = 0x80000000;
      auVar205._12_4_ = 0x80000000;
      auVar222._4_4_ = fVar225;
      auVar222._0_4_ = fVar225;
      auVar222._8_4_ = fVar225;
      auVar222._12_4_ = fVar225;
      auVar173._4_4_ = fVar196;
      auVar173._0_4_ = fVar196;
      auVar173._8_4_ = fVar196;
      auVar173._12_4_ = fVar196;
      local_540->type = Light;
      auVar227._4_4_ = fVar210;
      auVar227._0_4_ = fVar210;
      auVar227._8_4_ = fVar210;
      auVar227._12_4_ = fVar210;
      auVar119 = vmovlhps_avx(auVar222,auVar227);
      *(array<float,_4> *)(local_540->beta).values.values = local_4c8.values.values;
      *(undefined1 (*) [16])&local_540->field_2 = auVar119;
      IVar5 = (Interval)vmovlps_avx(auVar173);
      (local_540->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z = IVar5;
      (local_540->field_2).ei.super_Interaction.time = FVar120;
      (((Interaction *)&local_540->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      (((Interaction *)&local_540->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      (local_540->field_2).ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      uVar4 = vmovlps_avx(auVar205);
      (((Interaction *)&local_540->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.x =
           (float)(int)uVar4;
      (((Interaction *)&local_540->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y =
           (float)(int)((ulong)uVar4 >> 0x20);
      (local_540->field_2).ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = -fVar121;
      (local_540->field_2).ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float> =
           (Tuple2<pbrt::Point2,_float>)0x0;
      (local_540->field_2).ei.super_Interaction.mediumInterface = (MediumInterface *)0x0;
      (local_540->field_2).ei.super_Interaction.medium.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = uVar9;
      (local_540->field_2).ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)0x0;
      *(ulong *)((long)&local_540->field_2 + 0x58) = CONCAT44(local_330._4_4_,local_330._0_4_);
      *(ulong *)((long)&local_540->field_2 + 0x60) = CONCAT44(local_330._12_4_,local_330._8_4_);
      *(ulong *)((long)&local_540->field_2 + 0x68) = CONCAT44(local_330._20_4_,local_330._16_4_);
      *(ulong *)((long)&local_540->field_2 + 0x70) =
           CONCAT44(aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                    aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low);
      *(ulong *)((long)&local_540->field_2 + 0x78) =
           CONCAT44(aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high,
                    aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low);
      *(Interval *)((long)&local_540->field_2 + 0x80) =
           aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
           super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
      *(undefined8 *)((long)&local_540->field_2 + 0x88) = aStack_318._24_8_;
      *(ulong *)((long)&local_540->field_2 + 0x90) =
           CONCAT44(aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z,
                    aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y);
      *(ulong *)((long)&local_540->field_2 + 0x98) =
           CONCAT44(aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y,
                    aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x);
      *(undefined8 *)((long)&local_540->field_2 + 0xa0) = aStack_318._48_8_;
      *(ulong *)((long)&local_540->field_2 + 0xa8) =
           CONCAT44(aStack_318._60_4_,
                    aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y);
      *(ulong *)((long)&local_540->field_2 + 0xb0) = CONCAT44(aStack_318._68_4_,aStack_318._64_4_);
      *(ulong *)((long)&local_540->field_2 + 0xb8) =
           CONCAT44(aStack_318.ei.super_Interaction.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits._4_4_,
                    aStack_318.ei.super_Interaction.medium.
                    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                    .bits._0_4_);
      (local_540->field_2).si.material.
      super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      .bits = (uintptr_t)aStack_318.ei.field_0;
      (local_540->field_2).si.areaLight.
      super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      .bits = CONCAT44(aStack_318.mi.sigma_a.values.values[1],aStack_318.mi.sigma_a.values.values[0]
                      );
      *(ulong *)((long)&local_540->field_2 + 0xd0) =
           CONCAT44(aStack_318.mi.sigma_a.values.values[3],aStack_318.mi.sigma_a.values.values[2]);
      *(undefined1 (*) [64])((long)&local_540->field_2 + 0xcc) =
           ZEXT4464(CONCAT440(aStack_318.mi.sigma_maj.values.values[3],
                              CONCAT436(aStack_318.mi.sigma_maj.values.values[2],
                                        CONCAT1620(aStack_318._112_16_,
                                                   CONCAT416(aStack_318.mi.sigma_s.values.values[1],
                                                             CONCAT412(aStack_318.mi.sigma_s.values.
                                                                       values[0],
                                                                       CONCAT48(aStack_318.mi.
                                                                                sigma_a.values.
                                                                                values[3],
                                                                                CONCAT44(aStack_318.
                                                                                         mi.sigma_a.
                                                                                         values.
                                                  values[2],aStack_318.mi.sigma_a.values.values[1]))
                                                  ))))));
      (local_540->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
      (local_540->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      *(undefined8 *)&(local_540->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
      (local_540->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
      (local_540->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
      (local_540->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
      (local_540->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
      auVar142 = ZEXT1664(local_5a8);
      (local_540->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
      local_540->delta = false;
      local_540->pdfFwd = local_5d4;
      local_540->pdfRev = 0.0;
      local_5ec = local_5ec + 1;
    }
    goto LAB_003f4ada;
  }
  local_338.bits =
       (local_358->
       super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
       ).bits;
  local_340.
  super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  .bits = (TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           )(local_528->
            super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
  in_ZMM5 = ZEXT1664(in_ZMM5._0_16_);
  SurfaceInteraction::GetBSDF
            ((BSDF *)&local_468,(SurfaceInteraction *)&local_1b8.__align,ray,local_548,
             (CameraHandle *)&local_338,local_350,&local_340);
  auVar119 = in_ZMM5._0_16_;
  if (((ulong)local_468.sampler & 0xffffffffffff) == 0) {
    if ((byte)local_b8 == '\0') goto LAB_003f4b3f;
    SurfaceInteraction::SkipIntersection
              ((SurfaceInteraction *)&local_1b8.__align,ray,(Float)local_1b8._248_4_);
    iVar108 = 2;
  }
  else {
    if ((regularize != false) && (local_5fe == true)) {
      *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
      BSDF::Regularize((BSDF *)&local_468);
    }
    local_330._0_4_ = 2.8026e-45;
    *(long *)(in_FS_OFFSET + -0x298) = *(long *)(in_FS_OFFSET + -0x298) + 1;
    local_330._4_4_ = local_4c8.values.values[0];
    local_330._8_4_ = local_4c8.values.values[1];
    local_330._12_4_ = local_4c8.values.values[2];
    local_330._16_4_ = local_4c8.values.values[3];
    aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low = local_1b8._0_4_;
    aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high = local_1b8._4_4_;
    aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = local_1b8._8_4_;
    aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high = local_1b8._12_4_;
    aStack_318._16_16_ = local_1b8._16_16_;
    aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = local_1b8._32_4_;
    aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = local_1b8._36_4_;
    aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = local_1b8._40_4_;
    aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = local_1b8._44_4_;
    aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = local_1b8._48_4_;
    aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = local_1b8._52_4_;
    aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = local_1b8._56_4_;
    aStack_318._60_4_ = local_1b8._60_4_;
    aStack_318._64_4_ = (undefined4)local_1b8._64_8_;
    aStack_318._68_4_ = (undefined4)((ulong)local_1b8._64_8_ >> 0x20);
    aStack_318.ei.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._0_4_ = (undefined4)local_1b8._72_8_;
    aStack_318.ei.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits._4_4_ = (undefined4)((ulong)local_1b8._72_8_ >> 0x20);
    aStack_318._144_8_ = local_1b8._144_8_;
    aStack_318.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_1b8._152_8_;
    aStack_318.si.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         (float)((ulong)local_1b8._152_8_ >> 0x20);
    aStack_318._160_8_ = local_1b8._160_8_;
    aStack_318._168_8_ = local_1b8._168_8_;
    aStack_318._176_8_ = local_1b8._176_8_;
    aStack_318._184_8_ = local_1b8._184_8_;
    aStack_318.ei.field_0 = local_1b8._80_8_;
    aStack_318.mi.sigma_a.values.values[0] = local_1b8._88_4_;
    aStack_318.mi.sigma_a.values.values[1] = local_1b8._92_4_;
    aStack_318.mi.sigma_a.values.values[2] = local_1b8._96_4_;
    aStack_318.mi.sigma_a.values.values[3] = local_1b8._100_4_;
    aStack_318.mi.sigma_s.values.values[0] = local_1b8._104_4_;
    aStack_318.mi.sigma_s.values.values[1] = local_1b8._108_4_;
    aStack_318._112_16_ = local_1b8._112_16_;
    aStack_318.mi.sigma_maj.values.values[2] = (float)local_1b8._128_4_;
    aStack_318.mi.sigma_maj.values.values[3] = (float)local_1b8._132_4_;
    aStack_318.mi.Le.values.values[0] = (float)local_1b8._136_4_;
    aStack_318.mi.Le.values.values[1] = (float)local_1b8._140_4_;
    aStack_318.si.material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = (MaterialHandle)(MaterialHandle)local_1b8._192_8_;
    aStack_318.si.areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = (LightHandle)(LightHandle)local_1b8._200_8_;
    aStack_318._240_8_ = local_1b8._240_8_;
    auVar78._8_8_ = local_468.pdfFwd;
    auVar78._0_8_ = local_468.vertex;
    auVar78._16_8_ = local_468.prev;
    auVar78._24_8_ = local_468.bounces;
    aStack_318._208_8_ = local_1b8._208_8_;
    aStack_318._216_8_ = local_1b8._216_8_;
    aStack_318._224_8_ = local_1b8._224_8_;
    aStack_318._232_8_ = local_1b8._232_8_;
    pbStack_218 = local_468.terminated;
    pSStack_210 = local_468.beta;
    auStack_1f8 = auVar78._16_16_;
    pFStack_200 = local_468.pdfFwd;
    local_208 = local_468.vertex;
    local_1e8 = false;
    local_1e4._0_4_ = 0.0;
    local_1e4._4_4_ = 0.0;
    in_ZMM5 = ZEXT1664(auVar119);
    local_220.
    super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
    .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
             )(TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
               )local_468.sampler;
    FVar120 = Vertex::ConvertDensity(local_4e0,local_5d4,(Vertex *)local_330);
    local_1e4._0_4_ = FVar120;
    memcpy(local_540,(Vertex *)local_330,0x158);
    pSVar82 = local_528;
    iVar108 = 3;
    local_5ec = local_5ec + 1;
    if (local_5ec < maxDepth) {
      uVar86 = (local_528->
               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
      _fStack_4d0 = 0;
      local_4d8 = (undefined1  [8])local_1b8._28_8_;
      local_330._0_4_ = (undefined4)uVar86;
      local_330._4_4_ = (undefined4)(uVar86 >> 0x20);
      local_5e8._0_4_ = local_1b8._36_4_;
      FVar120 = DispatchSplit<9>::operator()((DispatchSplit<9> *)local_588,local_330,uVar86 >> 0x30)
      ;
      uVar86 = (pSVar82->
               super_TaggedPointer<pbrt::RandomSampler,_pbrt::StratifiedSampler,_pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::SobolSampler,_pbrt::ZSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
      local_538._0_4_ = FVar120;
      uVar77 = (ushort)(uVar86 >> 0x30);
      uVar85 = (uint)uVar77;
      if (uVar86 >> 0x30 < 5) {
        if (uVar86 < 0x3000000000000) {
          if (uVar85 == 2) {
            u2 = (Tuple2<pbrt::Point2,_float>)
                 StratifiedSampler::Get2D((StratifiedSampler *)(uVar86 & 0xffffffffffff));
          }
          else {
            u2 = (Tuple2<pbrt::Point2,_float>)
                 RandomSampler::Get2D((RandomSampler *)(uVar86 & 0xffffffffffff));
          }
        }
        else {
          this = (HaltonSampler *)(uVar86 & 0xffffffffffff);
          if ((uVar85 & 6) == 2) {
            iVar108 = this->dimension;
            if (0x3e6 < this->dimension) {
              iVar108 = 2;
            }
            this->dimension = iVar108 + 2;
            local_598._0_4_ = HaltonSampler::SampleDimension(this,iVar108);
            local_598._4_4_ = extraout_XMM0_Db;
            fStack_590 = (float)extraout_XMM0_Dc;
            fStack_58c = (float)extraout_XMM0_Dd;
            auVar155._0_4_ = HaltonSampler::SampleDimension(this,iVar108 + 1);
            auVar155._4_60_ = extraout_var_00;
            auVar119 = auVar155._0_16_;
LAB_003f4b03:
            auVar119 = vinsertps_avx(_local_598,auVar119,0x10);
            u2 = auVar119._0_8_;
          }
          else {
            u2 = (Tuple2<pbrt::Point2,_float>)PaddedSobolSampler::Get2D((PaddedSobolSampler *)this);
          }
        }
      }
      else {
        uVar92 = uVar77 - 4;
        if (uVar92 < 3) {
          if (uVar92 == 2) {
            u2 = (Tuple2<pbrt::Point2,_float>)
                 ZSobolSampler::Get2D((ZSobolSampler *)(uVar86 & 0xffffffffffff));
          }
          else {
            u2 = (Tuple2<pbrt::Point2,_float>)
                 SobolSampler::Get2D((SobolSampler *)(uVar86 & 0xffffffffffff));
          }
        }
        else {
          this_00 = (DebugMLTSampler *)(uVar86 & 0xffffffffffff);
          if (uVar85 - 6 < 2) {
            u2 = (Tuple2<pbrt::Point2,_float>)PMJ02BNSampler::Get2D((PMJ02BNSampler *)this_00);
          }
          else {
            if (uVar85 - 6 != 2) {
              local_598._0_4_ = DebugMLTSampler::Get1D(this_00);
              local_598._4_4_ = extraout_XMM0_Db_00;
              fStack_590 = (float)extraout_XMM0_Dc_00;
              fStack_58c = (float)extraout_XMM0_Dd_00;
              auVar156._0_4_ = DebugMLTSampler::Get1D(this_00);
              auVar156._4_60_ = extraout_var_01;
              auVar119 = auVar156._0_16_;
              goto LAB_003f4b03;
            }
            u2 = (Tuple2<pbrt::Point2,_float>)MLTSampler::Get2D((MLTSampler *)this_00);
          }
        }
      }
      auVar119 = _local_4d8;
      iVar108 = 3;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_5e8._0_4_;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_4d8._0_4_;
      woRender_00.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_4d8._4_4_;
      _local_4d8 = auVar119;
      BSDF::Sample_f((optional<pbrt::BSDFSample> *)local_588,(BSDF *)&local_468,woRender_00,
                     (Float)local_538._0_4_,(Point2f)u2,mode,All);
      if (local_55c == true) {
        auVar140._4_4_ = auStack_584._24_4_;
        auVar140._0_4_ = auStack_584._24_4_;
        auVar140._8_4_ = auStack_584._24_4_;
        auVar140._12_4_ = auStack_584._24_4_;
        local_5fe = (bool)(local_5fe | (auStack_584._28_4_ & 0x10) == 0);
        fVar121 = (float)local_1b8._136_4_ * (float)auStack_584._20_4_;
        auVar111 = ZEXT416((uint)fVar121);
        auVar119 = vfmadd132ss_fma(ZEXT416((uint)local_1b8._132_4_),ZEXT416((uint)fVar121),
                                   ZEXT416((uint)auStack_584._16_4_));
        local_5d4 = (Float)auStack_584._24_4_;
        auVar113 = vfmsub213ss_fma(ZEXT416((uint)local_1b8._136_4_),
                                   ZEXT416((uint)auStack_584._20_4_),ZEXT416((uint)fVar121));
        auVar119 = vfmadd231ss_fma(ZEXT416((uint)(auVar119._0_4_ + auVar113._0_4_)),
                                   ZEXT416((uint)local_1b8._128_4_),
                                   ZEXT416((uint)auStack_584._12_4_));
        uVar211 = auVar119._0_4_;
        auVar208._4_4_ = uVar211;
        auVar208._0_4_ = uVar211;
        auVar208._8_4_ = uVar211;
        auVar208._12_4_ = uVar211;
        auVar20._8_4_ = 0x7fffffff;
        auVar20._0_8_ = 0x7fffffff7fffffff;
        auVar20._12_4_ = 0x7fffffff;
        auVar119 = vandps_avx512vl(auVar208,auVar20);
        auVar209._0_4_ = auVar119._0_4_ * (float)local_588;
        auVar209._4_4_ = auVar119._4_4_ * (float)auStack_584._0_4_;
        auVar209._8_4_ = auVar119._8_4_ * (float)auStack_584._4_4_;
        auVar209._12_4_ = auVar119._12_4_ * (float)auStack_584._8_4_;
        auVar119 = vdivps_avx(auVar209,auVar140);
        local_4c8.values.values[1] = auVar119._4_4_ * local_4c8.values.values[1];
        local_4c8.values.values[0] = auVar119._0_4_ * local_4c8.values.values[0];
        local_4c8.values.values[2] = auVar119._8_4_ * local_4c8.values.values[2];
        local_4c8.values.values[3] = auVar119._12_4_ * local_4c8.values.values[3];
        wi.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_584._16_4_;
        wi.super_Tuple3<pbrt::Vector3,_float>.x = (float)auStack_584._12_4_;
        wi.super_Tuple3<pbrt::Vector3,_float>.z = (float)auStack_584._20_4_;
        SurfaceInteraction::SpawnRay
                  ((RayDifferential *)local_330,(SurfaceInteraction *)&local_1b8.__align,ray,
                   (BSDF *)&local_468,wi,auStack_584._28_4_,(Float)auStack_584._32_4_);
        auVar119 = aStack_318._16_16_;
        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_330._12_4_;
        (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y = (float)local_330._16_4_;
        *(ulong *)&(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z =
             CONCAT44(aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low,local_330._20_4_);
        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_330._0_4_;
        (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_330._4_4_;
        *(ulong *)&(ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z =
             CONCAT44(local_330._12_4_,local_330._8_4_);
        (ray->super_Ray).medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = CONCAT44(aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high,
                         aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low);
        IVar5.high = aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        IVar5.low = aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        IVar79.high = aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
        IVar79.low = aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
        *(ulong *)&local_360[2].high =
             CONCAT44(aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x,
                      aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z);
        *(ulong *)&local_360[3].high =
             CONCAT44(aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z,
                      aStack_318.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y);
        *(ulong *)&local_360[4].high =
             CONCAT44(aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y,
                      aStack_318.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x);
        *(ulong *)&local_360[5].high = CONCAT44(aStack_318._64_4_,aStack_318._60_4_);
        *local_360 = aStack_318.ei.super_Interaction.pi.super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
        local_360[1].low = (Float)aStack_318._24_4_;
        local_360[1].high = aStack_318.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        local_360[2] = IVar5;
        local_360[3] = IVar79;
        aStack_318._16_16_ = auVar119;
        if (local_55c == false) {
LAB_003f4b3f:
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
        }
        woRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)auStack_584._16_4_;
        woRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)auStack_584._12_4_;
        woRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)auStack_584._20_4_;
        in_ZMM5 = ZEXT1664(auVar111);
        wiRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = local_4d8;
        wiRender.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_5e8._0_4_;
        FVar120 = BSDF::PDF((BSDF *)&local_468,woRender,wiRender,local_3a0,All);
        pVVar81 = local_540;
        if (local_55c != true) goto LAB_003f4b3f;
        if ((auStack_584._28_4_ & 0x10) != 0) {
          FVar120 = 0.0;
          local_540->delta = true;
          local_5d4 = 0.0;
        }
        FVar120 = Vertex::ConvertDensity(local_540,FVar120,local_4e0);
        pVVar81[-1].pdfRev = FVar120;
        iVar108 = 0;
      }
    }
  }
  auVar142 = ZEXT1664(local_5a8);
LAB_003f4ada:
  if ((iVar108 != 0) && (iVar108 != 2)) {
    if (iVar108 == 3) {
LAB_003f4b1d:
      local_39c = local_5ec;
    }
    return local_39c;
  }
  goto LAB_003f1558;
}

Assistant:

int RandomWalk(const Integrator &integrator, SampledWavelengths &lambda,
               RayDifferential ray, SamplerHandle sampler, CameraHandle camera,
               ScratchBuffer &scratchBuffer, SampledSpectrum beta, Float pdf,
               int maxDepth, TransportMode mode, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Follow random walk to initialize BDPT path vertices
    int bounces = 0;
    bool anyNonSpecularBounces = false;
    Float pdfFwd = pdf;
    while (true) {
        // Attempt to create the next subpath vertex in _path_
        PBRT_DBG("%s\n", StringPrintf("Random walk. Bounces %d, beta %s, pdfFwd %f",
                                      bounces, beta, pdfFwd)
                             .c_str());
        if (!beta)
            break;
        bool scattered = false, terminated = false;
        // Trace a ray and sample the medium, if any
        Vertex &vertex = path[bounces], &prev = path[bounces - 1];
        pstd::optional<ShapeIntersection> si = integrator.Intersect(ray);
        if (ray.medium) {
            // Sample participating medium for _RandomWalk()_ ray
            Float tMax = si ? si->tHit : Infinity;
            RNG rng(Hash(ray.d.x), Hash(ray.d.y));
            Float u = sampler.Get1D();
            SampledSpectrum Tmaj = ray.medium.SampleTmaj(
                ray, tMax, u, rng, lambda, [&](const MediumSample &ms) {
                    const MediumInteraction &intr = ms.intr;
                    // Compute medium event probabilities for interaction
                    Float pAbsorb = intr.sigma_a[0] / intr.sigma_maj[0];
                    Float pScatter = intr.sigma_s[0] / intr.sigma_maj[0];
                    Float pNull = std::max<Float>(0, 1 - pAbsorb - pScatter);

                    // Randomly sample medium event for _RandomRalk()_ ray
                    Float um = sampler.Get1D();
                    int mode = SampleDiscrete({pAbsorb, pScatter, pNull}, um);
                    if (mode == 0) {
                        // Handle absorption for _RandomWalk()_ ray
                        terminated = true;
                        return false;

                    } else if (mode == 1) {
                        // Handle scattering for _RandomWalk()_ ray
                        beta *= ms.Tmaj * intr.sigma_s / (ms.Tmaj[0] * intr.sigma_s[0]);
                        // Record medium interaction in _path_ and compute forward density
                        vertex = Vertex::CreateMedium(intr, beta, pdfFwd, prev);
                        if (++bounces >= maxDepth) {
                            terminated = true;
                            return false;
                        }

                        // Sample direction and compute reverse density at preceding
                        // vertex
                        pstd::optional<PhaseFunctionSample> ps =
                            intr.phase.Sample_p(-ray.d, sampler.Get2D());
                        if (!ps || ps->pdf == 0) {
                            terminated = true;
                            return false;
                        }
                        // Update path state and previous path verex after medium
                        // scattering
                        pdfFwd = ps->pdf;
                        beta *= ps->p / ps->pdf;
                        ray = intr.SpawnRay(ps->wi);
                        anyNonSpecularBounces = true;
                        prev.pdfRev = vertex.ConvertDensity(ps->pdf, prev);

                        scattered = true;
                        return false;

                    } else {
                        // Handle null scattering for _RandomWalk()_ ray
                        SampledSpectrum sigma_n = intr.sigma_n();
                        beta *= ms.Tmaj * sigma_n / (ms.Tmaj[0] * sigma_n[0]);
                        return true;
                    }
                });
            // Update _beta_ for medium transmittance
            if (!scattered)
                beta *= Tmaj / Tmaj[0];
        }

        if (terminated)
            return bounces;
        if (scattered)
            continue;
        // Handle escaped rays after no medium scattering event
        if (!si) {
            // Capture escaped rays when tracing from the camera
            if (mode == TransportMode::Radiance) {
                vertex = Vertex::CreateLight(EndpointInteraction(ray), beta, pdfFwd);
                ++bounces;
            }

            break;
        }

        // Handle surface interaction for path generation
        SurfaceInteraction &isect = si->intr;
        // Get BSDF and skip over medium boundaries
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            continue;
        }

        // Possibly regularize the BSDF
        if (regularize && anyNonSpecularBounces) {
            ++regularizedBSDFs;
            bsdf.Regularize();
        }

        ++totalBSDFs;
        // Initialize _vertex_ with surface intersection information
        vertex = Vertex::CreateSurface(isect, bsdf, beta, pdfFwd, prev);

        if (++bounces >= maxDepth)
            break;
        // Sample BSDF at current vertex
        Vector3f wo = isect.wo;
        Float u = sampler.Get1D();
        pstd::optional<BSDFSample> bs = bsdf.Sample_f(wo, u, sampler.Get2D(), mode);
        if (!bs)
            break;
        pdfFwd = bs->pdf;
        anyNonSpecularBounces |= !bs->IsSpecular();
        beta *= bs->f * AbsDot(bs->wi, isect.shading.n) / bs->pdf;
        ray = isect.SpawnRay(ray, bsdf, bs->wi, bs->flags, bs->eta);

        // Compute path probabilities at surface vertex
        // TODO: confirm. I believe that !mode is right. Interestingly,
        // it makes no difference in the test suite either way.
        Float pdfRev = bsdf.PDF(bs->wi, wo, !mode);
        if (bs->IsSpecular()) {
            vertex.delta = true;
            pdfRev = pdfFwd = 0;
        }
        PBRT_DBG("%s\n",
                 StringPrintf("Random walk beta after shading normal correction %s", beta)
                     .c_str());
        prev.pdfRev = vertex.ConvertDensity(pdfRev, prev);
    }
    return bounces;
}